

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O3

int av1_choose_var_based_partitioning
              (AV1_COMP *cpi,TileInfo *tile,ThreadData_conflict *td,MACROBLOCK *x,int mi_row,
              int mi_col)

{
  MACROBLOCKD *xd;
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  BLOCK_SIZE BVar4;
  uint8_t uVar5;
  byte bVar6;
  BLOCK_SIZE BVar7;
  ushort uVar8;
  ushort uVar9;
  uint32_t uVar10;
  SOURCE_SAD SVar11;
  SequenceHeader *pSVar12;
  MB_MODE_INFO *pMVar13;
  MB_MODE_INFO *pMVar14;
  undefined8 *puVar15;
  MB_MODE_INFO *pMVar16;
  bool bVar17;
  int64_t threshold;
  int64_t threshold_00;
  int64_t threshold_01;
  _Bool _Var18;
  PART_EVAL_STATUS PVar19;
  uint uVar20;
  int iVar21;
  NOISE_LEVEL NVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  YV12_BUFFER_CONFIG *pYVar27;
  RefCntBuffer *pRVar28;
  YV12_BUFFER_CONFIG *pYVar29;
  YV12_BUFFER_CONFIG *pYVar30;
  scale_factors *psVar31;
  AV1_PRIMARY *pAVar32;
  int *piVar33;
  undefined4 extraout_var;
  long lVar34;
  long lVar35;
  int *piVar36;
  byte bVar37;
  sbyte sVar38;
  byte bVar39;
  int16_t iVar40;
  int iVar41;
  uint uVar42;
  int iVar43;
  long lVar44;
  undefined8 *puVar45;
  ushort uVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  scale_factors *psVar50;
  long lVar51;
  undefined8 *puVar52;
  long lVar53;
  uint uVar54;
  uint uVar55;
  uint8_t *puVar56;
  buf_2d *pbVar57;
  undefined4 *puVar58;
  undefined4 *puVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  uint uVar64;
  long lVar63;
  uint8_t *puVar65;
  long lVar66;
  long lVar67;
  int iVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  ulong uVar75;
  int *piVar76;
  int lvl2_idx;
  long lVar77;
  uint uVar78;
  long lVar79;
  int lvl2_idx_1;
  uint uVar80;
  uint uVar81;
  uint8_t *puVar82;
  int lvl2_idx_3;
  uint uVar83;
  long lVar84;
  int lvl3_idx_1;
  uint64_t blk_sad;
  ulong uVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  int iVar89;
  uint uVar90;
  double dVar91;
  int iVar94;
  int iVar95;
  int iVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar102;
  int iVar103;
  long lVar104;
  char local_339;
  short local_320;
  uint8_t *local_2c0;
  short local_2a0;
  short local_288;
  uint local_278;
  short local_260;
  uint uv_sad [2];
  int64_t local_238;
  int64_t iStack_230;
  int64_t local_228;
  int64_t iStack_220;
  int64_t local_218;
  ulong local_208;
  uint local_200;
  uint local_1fc;
  undefined8 local_1f8;
  PART_EVAL_STATUS *local_1f0;
  int sum [4];
  uint sse [4];
  long local_1c8;
  PART_EVAL_STATUS local_188 [5];
  PART_EVAL_STATUS local_183 [16];
  PART_EVAL_STATUS aPStack_173 [75];
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int src_avg [4];
  scale_factors sf_no_scale;
  int avg_16x16 [4] [4];
  int minvar_16x16 [4] [4];
  int maxvar_16x16 [4] [4];
  
  iVar68 = (cpi->common).width;
  iVar102 = (cpi->common).height;
  av1_setup_scale_factors_for_frame(&sf_no_scale,iVar68,iVar102,iVar68,iVar102);
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    bVar86 = true;
  }
  else if (cpi->ppi->use_svc == 0) {
    bVar86 = false;
  }
  else {
    bVar86 = (cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame != 0;
  }
  pSVar12 = (cpi->common).seq_params;
  BVar4 = pSVar12->sb_size;
  uVar80 = (uint)(BVar4 != BLOCK_64X64) * 3 + 0xc;
  if ((((cpi->sf).rt_sf.skip_encoding_non_reference_slide_change != 0) &&
      ((cpi->rc).high_source_sad != 0)) && ((cpi->ppi->rtc_ref).non_reference_frame != 0)) {
    av1_set_fixed_partitioning
              (cpi,tile,(cpi->common).mi_params.mi_grid_base +
                        ((cpi->common).mi_params.mi_stride * mi_row + mi_col),mi_row,mi_col,
               (BLOCK_SIZE)uVar80);
    x->force_zeromv_skip_for_sb = 1;
    return 0;
  }
  local_238 = (cpi->vbp_info).thresholds[0];
  iStack_230 = (cpi->vbp_info).thresholds[1];
  local_228 = (cpi->vbp_info).thresholds[2];
  iStack_220 = (cpi->vbp_info).thresholds[3];
  local_218 = (cpi->vbp_info).thresholds[4];
  if ((cpi->src_sad_blk_64x64 == (uint64_t *)0x0) ||
     ((cpi->svc).spatial_layer_id != (cpi->svc).number_spatial_layers + -1)) {
    blk_sad = 0;
  }
  else {
    iVar68 = pSVar12->mib_size >> (BVar4 == BLOCK_128X128);
    blk_sad = cpi->src_sad_blk_64x64
              [(mi_row / iVar68) * (((cpi->common).mi_params.mi_cols + iVar68 + -1) / iVar68) +
               mi_col / iVar68];
  }
  uVar60 = *(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7;
  if ((((cpi->oxcf).q_cfg.aq_mode == '\x03') && ((cpi->common).seg.enabled != '\0')) &&
     (uVar60 - 1 < 2)) {
    iVar68 = av1_get_qindex(&(cpi->common).seg,uVar60,(cpi->common).quant_params.base_qindex);
    _Var18 = true;
  }
  else {
    iVar68 = (cpi->common).quant_params.base_qindex;
    _Var18 = false;
  }
  set_vbp_thresholds(cpi,&local_238,blk_sad,iVar68,(x->content_state_sb).low_sumdiff,
                     (x->content_state_sb).source_sad_nonrd,(x->content_state_sb).source_sad_rd,
                     _Var18,(x->content_state_sb).lighting_change);
  puVar56 = x->plane[0].src.buf;
  iVar68 = x->plane[0].src.stride;
  local_188[0] = '\0';
  (x->part_search_info).variance_low[0x59] = '\0';
  (x->part_search_info).variance_low[0x5a] = '\0';
  (x->part_search_info).variance_low[0x5b] = '\0';
  (x->part_search_info).variance_low[0x5c] = '\0';
  (x->part_search_info).variance_low[0x5d] = '\0';
  (x->part_search_info).variance_low[0x5e] = '\0';
  (x->part_search_info).variance_low[0x5f] = '\0';
  (x->part_search_info).variance_low[0x60] = '\0';
  (x->part_search_info).variance_low[0x61] = '\0';
  (x->part_search_info).variance_low[0x62] = '\0';
  (x->part_search_info).variance_low[99] = '\0';
  (x->part_search_info).variance_low[100] = '\0';
  (x->part_search_info).variance_low[0x65] = '\0';
  (x->part_search_info).variance_low[0x66] = '\0';
  (x->part_search_info).variance_low[0x67] = '\0';
  (x->part_search_info).variance_low[0x68] = '\0';
  (x->part_search_info).variance_low[0x50] = '\0';
  (x->part_search_info).variance_low[0x51] = '\0';
  (x->part_search_info).variance_low[0x52] = '\0';
  (x->part_search_info).variance_low[0x53] = '\0';
  (x->part_search_info).variance_low[0x54] = '\0';
  (x->part_search_info).variance_low[0x55] = '\0';
  (x->part_search_info).variance_low[0x56] = '\0';
  (x->part_search_info).variance_low[0x57] = '\0';
  (x->part_search_info).variance_low[0x58] = '\0';
  (x->part_search_info).variance_low[0x59] = '\0';
  (x->part_search_info).variance_low[0x5a] = '\0';
  (x->part_search_info).variance_low[0x5b] = '\0';
  (x->part_search_info).variance_low[0x5c] = '\0';
  (x->part_search_info).variance_low[0x5d] = '\0';
  (x->part_search_info).variance_low[0x5e] = '\0';
  (x->part_search_info).variance_low[0x5f] = '\0';
  (x->part_search_info).variance_low[0x40] = '\0';
  (x->part_search_info).variance_low[0x41] = '\0';
  (x->part_search_info).variance_low[0x42] = '\0';
  (x->part_search_info).variance_low[0x43] = '\0';
  (x->part_search_info).variance_low[0x44] = '\0';
  (x->part_search_info).variance_low[0x45] = '\0';
  (x->part_search_info).variance_low[0x46] = '\0';
  (x->part_search_info).variance_low[0x47] = '\0';
  (x->part_search_info).variance_low[0x48] = '\0';
  (x->part_search_info).variance_low[0x49] = '\0';
  (x->part_search_info).variance_low[0x4a] = '\0';
  (x->part_search_info).variance_low[0x4b] = '\0';
  (x->part_search_info).variance_low[0x4c] = '\0';
  (x->part_search_info).variance_low[0x4d] = '\0';
  (x->part_search_info).variance_low[0x4e] = '\0';
  (x->part_search_info).variance_low[0x4f] = '\0';
  (x->part_search_info).variance_low[0x30] = '\0';
  (x->part_search_info).variance_low[0x31] = '\0';
  (x->part_search_info).variance_low[0x32] = '\0';
  (x->part_search_info).variance_low[0x33] = '\0';
  (x->part_search_info).variance_low[0x34] = '\0';
  (x->part_search_info).variance_low[0x35] = '\0';
  (x->part_search_info).variance_low[0x36] = '\0';
  (x->part_search_info).variance_low[0x37] = '\0';
  (x->part_search_info).variance_low[0x38] = '\0';
  (x->part_search_info).variance_low[0x39] = '\0';
  (x->part_search_info).variance_low[0x3a] = '\0';
  (x->part_search_info).variance_low[0x3b] = '\0';
  (x->part_search_info).variance_low[0x3c] = '\0';
  (x->part_search_info).variance_low[0x3d] = '\0';
  (x->part_search_info).variance_low[0x3e] = '\0';
  (x->part_search_info).variance_low[0x3f] = '\0';
  (x->part_search_info).variance_low[0x20] = '\0';
  (x->part_search_info).variance_low[0x21] = '\0';
  (x->part_search_info).variance_low[0x22] = '\0';
  (x->part_search_info).variance_low[0x23] = '\0';
  (x->part_search_info).variance_low[0x24] = '\0';
  (x->part_search_info).variance_low[0x25] = '\0';
  (x->part_search_info).variance_low[0x26] = '\0';
  (x->part_search_info).variance_low[0x27] = '\0';
  (x->part_search_info).variance_low[0x28] = '\0';
  (x->part_search_info).variance_low[0x29] = '\0';
  (x->part_search_info).variance_low[0x2a] = '\0';
  (x->part_search_info).variance_low[0x2b] = '\0';
  (x->part_search_info).variance_low[0x2c] = '\0';
  (x->part_search_info).variance_low[0x2d] = '\0';
  (x->part_search_info).variance_low[0x2e] = '\0';
  (x->part_search_info).variance_low[0x2f] = '\0';
  (x->part_search_info).variance_low[0x10] = '\0';
  (x->part_search_info).variance_low[0x11] = '\0';
  (x->part_search_info).variance_low[0x12] = '\0';
  (x->part_search_info).variance_low[0x13] = '\0';
  (x->part_search_info).variance_low[0x14] = '\0';
  (x->part_search_info).variance_low[0x15] = '\0';
  (x->part_search_info).variance_low[0x16] = '\0';
  (x->part_search_info).variance_low[0x17] = '\0';
  (x->part_search_info).variance_low[0x18] = '\0';
  (x->part_search_info).variance_low[0x19] = '\0';
  (x->part_search_info).variance_low[0x1a] = '\0';
  (x->part_search_info).variance_low[0x1b] = '\0';
  (x->part_search_info).variance_low[0x1c] = '\0';
  (x->part_search_info).variance_low[0x1d] = '\0';
  (x->part_search_info).variance_low[0x1e] = '\0';
  (x->part_search_info).variance_low[0x1f] = '\0';
  (x->part_search_info).variance_low[0] = '\0';
  (x->part_search_info).variance_low[1] = '\0';
  (x->part_search_info).variance_low[2] = '\0';
  (x->part_search_info).variance_low[3] = '\0';
  (x->part_search_info).variance_low[4] = '\0';
  (x->part_search_info).variance_low[5] = '\0';
  (x->part_search_info).variance_low[6] = '\0';
  (x->part_search_info).variance_low[7] = '\0';
  (x->part_search_info).variance_low[8] = '\0';
  (x->part_search_info).variance_low[9] = '\0';
  (x->part_search_info).variance_low[10] = '\0';
  (x->part_search_info).variance_low[0xb] = '\0';
  (x->part_search_info).variance_low[0xc] = '\0';
  (x->part_search_info).variance_low[0xd] = '\0';
  (x->part_search_info).variance_low[0xe] = '\0';
  (x->part_search_info).variance_low[0xf] = '\0';
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
LAB_002503a8:
    bVar88 = false;
  }
  else {
    lVar26 = (long)(cpi->common).remapped_ref_idx[0];
    if ((lVar26 == -1) ||
       (pRVar28 = (cpi->common).ref_frame_map[lVar26], pRVar28 == (RefCntBuffer *)0x0)) {
      bVar88 = false;
      bVar86 = true;
    }
    else {
      if (((pRVar28->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
         ((pRVar28->buf).field_2.field_0.y_crop_width == (cpi->common).width)) goto LAB_002503a8;
      pYVar27 = av1_get_scaled_ref_frame(cpi,1);
      bVar86 = (bool)(bVar86 | pYVar27 == (YV12_BUFFER_CONFIG *)0x0);
      bVar88 = true;
    }
  }
  xd = &x->e_mbd;
  x->source_variance = 0xffffffff;
  if (((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) &&
     (kLowSad < (x->content_state_sb).source_sad_nonrd)) {
    uVar20 = av1_get_perpixel_variance_facade
                       (cpi,xd,&x->plane[0].src,((cpi->common).seq_params)->sb_size,0);
    x->source_variance = uVar20;
  }
  if (bVar86) {
    uv_sad[0] = 0;
    uv_sad[1] = 0;
    uVar55 = 0xffffffff;
    local_339 = '\x01';
    local_2c0 = (uint8_t *)0x0;
    iVar102 = 0;
  }
  else {
    uVar5 = ((cpi->common).seq_params)->monochrome;
    pMVar16 = *(x->e_mbd).mi;
    if (bVar88) {
      pYVar27 = av1_get_scaled_ref_frame(cpi,1);
    }
    else {
      lVar26 = (long)(cpi->common).remapped_ref_idx[0];
      if (lVar26 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[lVar26];
      }
      pYVar27 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar27 = (YV12_BUFFER_CONFIG *)0x0;
      }
    }
    bVar87 = true;
    bVar17 = true;
    if ((cpi->ref_frame_flags & 1U) == 0) {
      bVar17 = 1 < (cpi->svc).number_spatial_layers;
    }
    if (((cpi->ppi->rtc_ref).set_ref_frame_config == 0) &&
       ((cpi->sf).rt_sf.use_nonrd_altref_frame == 0)) {
      if ((cpi->sf).rt_sf.use_comp_ref_nonrd == 0) {
        bVar87 = false;
      }
      else {
        bVar87 = (cpi->sf).rt_sf.ref_frame_comp_nonrd[2] == 1;
      }
    }
    iVar102 = (uint)(uVar5 == '\0') * 2;
    iVar48 = iVar102 + 1;
    pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
    if ((cpi->ref_frame_flags & 8U) == 0) {
LAB_0025058f:
      uVar75 = 0xffffffff;
    }
    else {
      uVar75 = 0xffffffff;
      if ((cpi->svc).number_spatial_layers == 1) {
        if ((bool)((x->content_state_sb).source_sad_nonrd == kZeroSad & bVar17)) {
          pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
          goto LAB_0025058f;
        }
        iVar24 = (cpi->common).remapped_ref_idx[3];
        if (iVar24 != -1) {
          pRVar28 = (cpi->common).ref_frame_map[iVar24];
          if (pRVar28 != (RefCntBuffer *)0x0) {
            if (((pRVar28->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
               ((pRVar28->buf).field_2.field_0.y_crop_width == (cpi->common).width)) {
              pYVar29 = &pRVar28->buf;
              if (pYVar29 == pYVar27) goto LAB_0025058f;
              psVar31 = (cpi->common).ref_scale_factors + iVar24;
LAB_0025061b:
              av1_setup_pre_planes(xd,0,pYVar29,mi_row,mi_col,psVar31,iVar48);
              uVar20 = (*cpi->ppi->fn_ptr[uVar80].sdf)
                                 (x->plane[0].src.buf,x->plane[0].src.stride,
                                  (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
              uVar75 = (ulong)uVar20;
            }
            else {
              pYVar29 = av1_get_scaled_ref_frame(cpi,4);
              if (pYVar29 == (YV12_BUFFER_CONFIG *)0x0) {
                pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
              }
              else if (pYVar29 != pYVar27) {
                psVar31 = (scale_factors *)0x0;
                goto LAB_0025061b;
              }
              uVar75 = 0xffffffff;
            }
            goto LAB_00250691;
          }
        }
        pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
      }
    }
LAB_00250691:
    uVar20 = 0xffffffff;
    uVar42 = (uint)uVar75;
    if ((((!(bool)((cpi->svc).number_spatial_layers == 1 & bVar87)) ||
         ((cpi->ref_frame_flags & 0x40) == 0)) ||
        ((bool)((x->content_state_sb).source_sad_nonrd == kZeroSad & bVar17))) ||
       (iVar24 = (cpi->common).remapped_ref_idx[6], iVar24 == -1)) {
LAB_0025073f:
      pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
    }
    else {
      pRVar28 = (cpi->common).ref_frame_map[iVar24];
      if (pRVar28 == (RefCntBuffer *)0x0) goto LAB_0025073f;
      if (((pRVar28->buf).field_3.field_0.y_crop_height == (cpi->common).height) &&
         ((pRVar28->buf).field_2.field_0.y_crop_width == (cpi->common).width)) {
        pYVar30 = &pRVar28->buf;
        if (pYVar30 != pYVar27) {
          psVar31 = (cpi->common).ref_scale_factors + iVar24;
LAB_002508bf:
          av1_setup_pre_planes(xd,0,pYVar30,mi_row,mi_col,psVar31,iVar48);
          uVar20 = (*cpi->ppi->fn_ptr[uVar80].sdf)
                             (x->plane[0].src.buf,x->plane[0].src.stride,
                              (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
        }
      }
      else {
        pYVar30 = av1_get_scaled_ref_frame(cpi,7);
        if (pYVar30 == (YV12_BUFFER_CONFIG *)0x0) {
          pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
          uVar20 = 0xffffffff;
        }
        else {
          uVar20 = 0xffffffff;
          if (pYVar30 != pYVar27) {
            psVar31 = (scale_factors *)0x0;
            goto LAB_002508bf;
          }
        }
      }
    }
    uVar49 = 0xffffffff;
    if (bVar17) {
      SVar11 = (x->content_state_sb).source_sad_nonrd;
      if (bVar88) {
        psVar31 = (scale_factors *)0x0;
      }
      else {
        iVar24 = (cpi->common).remapped_ref_idx[0];
        psVar31 = (scale_factors *)0x0;
        if (iVar24 != -1) {
          psVar31 = (cpi->common).ref_scale_factors + iVar24;
        }
      }
      av1_setup_pre_planes(xd,0,pYVar27,mi_row,mi_col,psVar31,iVar48);
      pMVar16->ref_frame[0] = '\x01';
      pMVar16->ref_frame[1] = -1;
      pMVar16->bsize = ((cpi->common).seq_params)->sb_size;
      pMVar16->mv[0].as_int = 0;
      (pMVar16->interp_filters).as_int = 0x30003;
      iVar24 = (cpi->sf).rt_sf.estimate_motion_for_var_based_partition;
      iVar23 = 2;
      if ((int)SVar11 < 4) {
        iVar23 = iVar24;
      }
      if (iVar24 < 3) {
        iVar23 = iVar24;
      }
      if (((iVar23 - 1U < 2) && (-1 < (x->e_mbd).mb_to_right_edge)) &&
         ((-1 < (x->e_mbd).mb_to_bottom_edge && (2 < (int)SVar11 && 100 < x->source_variance)))) {
        iVar24 = 0x60;
        if ((3 < (int)SVar11) && ((cpi->rc).high_motion_content_screen_rtc == 0)) {
          if ((cpi->svc).temporal_layer_id == 0) {
            iVar24 = 0x200;
          }
          else {
            iVar24 = 0x60;
            if (2 < (cpi->rc).num_col_blscroll_last_tl0) {
              iVar24 = 0x200;
            }
          }
        }
        if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
          pMVar13 = *(x->e_mbd).mi;
          iVar61 = 0xc0;
          if (3 < (int)SVar11) {
            iVar61 = 0x200;
          }
          uVar49 = av1_int_pro_motion_estimation
                             (cpi,x,((cpi->common).seq_params)->sb_size,mi_row,mi_col,&kZeroMv,
                              (uint *)avg_16x16,iVar24,iVar61);
          if ((uint)avg_16x16[0][0] >> 1 <= uVar49) {
LAB_00250a96:
            x->sb_me_partition = 0;
            pMVar13->mv[0].as_int = 0;
            goto LAB_00250aaa;
          }
          uVar55 = 20000;
          if (((cpi->common).seq_params)->sb_size == BLOCK_128X128) {
            uVar55 = 50000;
          }
          if (uVar55 <= uVar49) goto LAB_00250a96;
          x->sb_me_partition = 1;
          x->sb_me_mv = pMVar13->mv[0];
          if ((cpi->svc).temporal_layer_id == 0) {
            uVar8 = pMVar13->mv[0].as_mv.row;
            uVar9 = pMVar13->mv[0].as_mv.col;
            uVar46 = -uVar9;
            if (0 < (short)uVar9) {
              uVar46 = uVar9;
            }
            if (uVar8 == 0 && 0x10 < uVar46) {
              x->sb_col_scroll = 1;
            }
            else {
              uVar46 = -uVar8;
              if (0 < (short)uVar8) {
                uVar46 = uVar8;
              }
              if ((uVar9 == 0) && (0x10 < uVar46)) {
                x->sb_row_scroll = 1;
              }
            }
          }
        }
        else {
          BVar7 = ((cpi->common).seq_params)->sb_size;
          avg_16x16[0][0] =
               av1_int_pro_motion_estimation
                         (cpi,x,BVar7,mi_row,mi_col,&kZeroMv,(uint *)avg_16x16,
                          (uint)(block_size_wide[BVar7] >> 1),(uint)(block_size_high[BVar7] >> 1));
LAB_00250aaa:
          uVar49 = avg_16x16[0][0];
          if (avg_16x16[0][0] == 0xffffffff) goto LAB_00250ab1;
        }
      }
      else {
LAB_00250ab1:
        uVar49 = (*cpi->ppi->fn_ptr[uVar80].sdf)
                           (x->plane[0].src.buf,x->plane[0].src.stride,
                            (x->e_mbd).plane[0].pre[0].buf,(x->e_mbd).plane[0].pre[0].stride);
      }
      if ((1 < iVar23) &&
         (((_Var18 = (x->e_mbd).up_available, _Var18 != false || ((x->e_mbd).left_available == true)
           ) && (SVar11 = (x->content_state_sb).source_sad_nonrd, iVar23 == 2 || (int)SVar11 < 4))))
      {
        iVar24 = (x->mv_limits).col_min << 3;
        if (iVar24 < -0x1ff7) {
          iVar24 = -0x1ff8;
        }
        iVar61 = (x->mv_limits).col_max << 3;
        if (0x1ff7 < iVar61) {
          iVar61 = 0x1ff8;
        }
        iVar103 = (x->mv_limits).row_min << 3;
        if (iVar103 < -0x1ff7) {
          iVar103 = -0x1ff8;
        }
        iVar43 = (x->mv_limits).row_max << 3;
        if (0x1ff7 < iVar43) {
          iVar43 = 0x1ff8;
        }
        if (iVar61 < iVar24) {
          iVar61 = iVar24;
        }
        if (iVar43 < iVar103) {
          iVar43 = iVar103;
        }
        if (0x3ffe < iVar61) {
          iVar61 = 0x3fff;
        }
        if (0x3ffe < iVar43) {
          iVar43 = 0x3fff;
        }
        pMVar13 = *(x->e_mbd).mi;
        uVar54 = (uint)pMVar13->mv[0].as_mv.row;
        uVar69 = (uint)pMVar13->mv[0].as_mv.col;
        uVar81 = 0;
        uVar64 = 0;
        uVar55 = 0xffffffff;
        local_288 = (short)((uVar54 - ((int)~uVar54 >> 0x1f)) + 3 >> 3);
        local_2a0 = (short)((uVar69 - ((int)~uVar69 >> 0x1f)) + 3 >> 3);
        if (_Var18 != false) {
          pMVar14 = (x->e_mbd).above_mbmi;
          if ((pMVar14->mode < 0xd) || (pMVar14->ref_frame[0] != '\x01')) {
            uVar81 = 0;
            uVar64 = 0;
          }
          else {
            iVar62 = (int)pMVar14->mv[0].as_mv >> 0x10;
            iVar25 = iVar61;
            if (iVar62 < iVar61) {
              iVar25 = iVar62;
            }
            iVar21 = (int)pMVar14->mv[0].as_mv.row;
            if (iVar62 < iVar24) {
              iVar25 = iVar24;
            }
            iVar62 = iVar43;
            if (iVar21 < iVar43) {
              iVar62 = iVar21;
            }
            if (iVar21 < iVar103) {
              iVar62 = iVar103;
            }
            uVar54 = (int)(short)iVar62 + (uint)(-1 < (short)iVar62) + 3;
            uVar81 = uVar54 >> 3;
            uVar69 = (uint)(-1 < (short)iVar25) + (int)(short)iVar25 + 3;
            uVar64 = uVar69 >> 3;
            iVar62 = (int)uVar54 >> 3;
            iVar21 = local_288 - iVar62;
            iVar25 = -iVar21;
            if (0 < iVar21) {
              iVar25 = iVar21;
            }
            iVar47 = (int)uVar69 >> 3;
            iVar41 = local_2a0 - iVar47;
            iVar21 = -iVar41;
            if (0 < iVar41) {
              iVar21 = iVar41;
            }
            if (iVar21 != 0 || iVar25 != 0) {
              iVar25 = (x->e_mbd).plane[0].pre[0].stride;
              uVar55 = (*cpi->ppi->fn_ptr[uVar80].sdf)
                                 (x->plane[0].src.buf,x->plane[0].src.stride,
                                  (x->e_mbd).plane[0].pre[0].buf + (iVar62 * iVar25 + iVar47),iVar25
                                 );
            }
          }
        }
        uVar69 = 0;
        uVar54 = 0xffffffff;
        iVar23 = 8 - (uint)(2 < (int)SVar11 && iVar23 != 2);
        if ((((x->e_mbd).left_available == true) &&
            (pMVar14 = (x->e_mbd).left_mbmi, 0xc < pMVar14->mode)) &&
           (pMVar14->ref_frame[0] == '\x01')) {
          iVar62 = (int)pMVar14->mv[0].as_mv >> 0x10;
          iVar25 = iVar61;
          if (iVar62 < iVar61) {
            iVar25 = iVar62;
          }
          iVar21 = (int)pMVar14->mv[0].as_mv.row;
          if (iVar62 < iVar24) {
            iVar25 = iVar24;
          }
          iVar62 = iVar43;
          if (iVar21 < iVar43) {
            iVar62 = iVar21;
          }
          if (iVar21 < iVar103) {
            iVar62 = iVar103;
          }
          uVar54 = (int)(short)iVar62 + (uint)(-1 < (short)iVar62) + 3;
          uVar69 = uVar54 >> 3;
          uVar70 = (int)(short)iVar25 + (uint)(-1 < (short)iVar25) + 3;
          uVar83 = uVar70 >> 3;
          iVar62 = (int)uVar54 >> 3;
          iVar21 = local_288 - iVar62;
          iVar25 = -iVar21;
          if (0 < iVar21) {
            iVar25 = iVar21;
          }
          iVar47 = (int)uVar70 >> 3;
          iVar41 = local_2a0 - iVar47;
          iVar21 = -iVar41;
          if (0 < iVar41) {
            iVar21 = iVar41;
          }
          if (iVar21 != 0 || iVar25 != 0) {
            iVar21 = (short)uVar81 - iVar62;
            iVar25 = -iVar21;
            if (0 < iVar21) {
              iVar25 = iVar21;
            }
            local_320 = (short)uVar64;
            iVar41 = local_320 - iVar47;
            iVar21 = -iVar41;
            if (0 < iVar41) {
              iVar21 = iVar41;
            }
            if (iVar21 != 0 || iVar25 != 0) {
              iVar25 = (x->e_mbd).plane[0].pre[0].stride;
              uVar54 = (*cpi->ppi->fn_ptr[uVar80].sdf)
                                 (x->plane[0].src.buf,x->plane[0].src.stride,
                                  (x->e_mbd).plane[0].pre[0].buf + (iVar62 * iVar25 + iVar47),iVar25
                                 );
              goto LAB_002536f4;
            }
          }
          uVar54 = 0xffffffff;
        }
        else {
          uVar83 = 0;
        }
LAB_002536f4:
        uVar70 = iVar23 * uVar49 >> 3;
        if ((uVar55 < uVar70) && (uVar55 < uVar54)) {
          iVar62 = (int)(short)(uVar64 << 3);
          iVar25 = iVar61;
          if (iVar62 < iVar61) {
            iVar25 = iVar62;
          }
          iVar40 = (int16_t)iVar25;
          if (iVar62 < iVar24) {
            iVar40 = (int16_t)iVar24;
          }
          pMVar13->mv[0].as_mv.col = iVar40;
          iVar62 = (int)(short)(uVar81 << 3);
          iVar25 = iVar43;
          if (iVar62 < iVar43) {
            iVar25 = iVar62;
          }
          if (iVar62 < iVar103) {
            iVar25 = iVar103;
          }
          pMVar13->mv[0].as_mv.row = (int16_t)iVar25;
          uVar70 = iVar23 * uVar55 >> 3;
          uVar49 = uVar55;
        }
        if ((uVar54 < uVar70) && (uVar54 < uVar55)) {
          iVar23 = (int)(uVar83 << 0x13) >> 0x10;
          if (iVar23 < iVar61) {
            iVar61 = iVar23;
          }
          if (iVar23 < iVar24) {
            iVar61 = iVar24;
          }
          pMVar13->mv[0].as_mv.col = (int16_t)iVar61;
          iVar24 = (int)(uVar69 << 0x13) >> 0x10;
          if (iVar24 < iVar43) {
            iVar43 = iVar24;
          }
          if (iVar24 < iVar103) {
            iVar43 = iVar103;
          }
          pMVar13->mv[0].as_mv.row = (int16_t)iVar43;
          uVar49 = uVar54;
        }
      }
    }
    dVar91 = (double)uVar49 * 0.9;
    if (dVar91 <= (double)uVar75) {
      if ((uVar42 <= uVar20) || (dVar91 <= (double)uVar20)) goto LAB_00250eef;
LAB_00250de2:
      iVar24 = (cpi->common).remapped_ref_idx[6];
      psVar31 = (scale_factors *)0x0;
      if (iVar24 != -1) {
        psVar31 = (cpi->common).ref_scale_factors + iVar24;
      }
      av1_setup_pre_planes(xd,0,pYVar30,mi_row,mi_col,psVar31,iVar48);
      pMVar16->ref_frame[0] = '\a';
      pMVar16->mv[0].as_int = 0;
      x->nonrd_prune_ref_frame_search = 0;
      x->sb_me_partition = 0;
      local_339 = '\a';
      uVar55 = uVar20;
    }
    else {
      if (dVar91 <= (double)uVar20) {
        if (uVar42 < uVar20) goto LAB_00250e6d;
      }
      else {
        if (uVar42 < uVar20) {
LAB_00250e6d:
          iVar24 = (cpi->common).remapped_ref_idx[3];
          psVar31 = (scale_factors *)0x0;
          if (iVar24 != -1) {
            psVar31 = (cpi->common).ref_scale_factors + iVar24;
          }
          av1_setup_pre_planes(xd,0,pYVar29,mi_row,mi_col,psVar31,iVar48);
          pMVar16->ref_frame[0] = '\x04';
          pMVar16->mv[0].as_int = 0;
          x->nonrd_prune_ref_frame_search = 0;
          x->sb_me_partition = 0;
          local_339 = '\x04';
          uVar55 = uVar42;
          goto LAB_00250f0c;
        }
        if (uVar42 >= uVar20 && uVar42 != uVar20) goto LAB_00250de2;
      }
LAB_00250eef:
      x->nonrd_prune_ref_frame_search = (cpi->sf).rt_sf.nonrd_prune_ref_frame_search;
      local_339 = '\x01';
      uVar55 = uVar49;
    }
LAB_00250f0c:
    if (pMVar16->mv[0].as_int != 0) {
      if (bVar88) {
        psVar31 = &sf_no_scale;
        (x->e_mbd).block_ref_scale_factors[0] = psVar31;
      }
      else {
        bVar39 = pMVar16->ref_frame[0];
        bVar6 = pMVar16->ref_frame[1];
        if ((char)bVar39 < '\t') {
          bVar37 = 1;
          if ('\x01' < (char)bVar39) {
            bVar37 = bVar39;
          }
          iVar48 = (cpi->common).remapped_ref_idx[bVar37 - 1];
          if (iVar48 == -1) goto LAB_00250f86;
          psVar31 = (cpi->common).ref_scale_factors + iVar48;
        }
        else {
LAB_00250f86:
          psVar31 = (scale_factors *)0x0;
        }
        (x->e_mbd).block_ref_scale_factors[0] = psVar31;
        if ((char)bVar6 < '\t') {
          bVar39 = 1;
          if ('\x01' < (char)bVar6) {
            bVar39 = bVar6;
          }
          iVar48 = (cpi->common).remapped_ref_idx[bVar39 - 1];
          if (iVar48 != -1) {
            psVar31 = (cpi->common).ref_scale_factors + iVar48;
            goto LAB_00250fd5;
          }
        }
        psVar31 = (scale_factors *)0x0;
      }
LAB_00250fd5:
      (x->e_mbd).block_ref_scale_factors[1] = psVar31;
      av1_enc_build_inter_predictor
                (&cpi->common,xd,mi_row,mi_col,(BUFFER_SET *)0x0,((cpi->common).seq_params)->sb_size
                 ,0,iVar102);
    }
    pMVar16 = *(x->e_mbd).mi;
    uVar10 = pMVar16->mv[0].as_int;
    uVar85 = (ulong)(uVar10 == 0);
    local_2c0 = (x->e_mbd).plane[0].pre[uVar85 - 1].buf;
    iVar102 = (x->e_mbd).plane[0].pre[uVar85 - 1].stride;
    uv_sad[0] = 0;
    uv_sad[1] = 0;
    if ((cpi->oxcf).tool_cfg.enable_monochrome == false) {
      SVar11 = (x->content_state_sb).source_sad_nonrd;
      if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
        if ((cpi->rc).high_source_sad == 0) {
          uVar54 = 6;
          if (((cpi->rc).percent_blocks_with_motion < 0x5b) ||
             (uVar54 = 6, (cpi->rc).frame_source_sad < 0x2711 || (int)SVar11 < 3))
          goto LAB_002510d3;
          sVar38 = 3;
          bVar39 = 8;
        }
        else {
          sVar38 = 1;
          bVar39 = 7;
          uVar54 = 6;
        }
      }
      else {
        uVar54 = (uint)((cpi->common).height * (cpi->common).width < 0x1fa400) * 2 + 3;
LAB_002510d3:
        sVar38 = 1;
        bVar39 = 3;
        if ((2 < (int)SVar11) &&
           ((500 < x->source_variance && (0x383ff < (cpi->common).height * (cpi->common).width)))) {
          bVar39 = SVar11 == kMedSad ^ 5;
          sVar38 = 2;
        }
      }
      iVar48 = (cpi->common).remapped_ref_idx[0];
      if (iVar48 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[iVar48];
      }
      pYVar27 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar27 = (YV12_BUFFER_CONFIG *)0x0;
      }
      lVar26 = (long)(cpi->common).remapped_ref_idx[3];
      if (lVar26 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[lVar26];
      }
      pYVar29 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar29 = (YV12_BUFFER_CONFIG *)0x0;
      }
      lVar26 = (long)(cpi->common).remapped_ref_idx[6];
      uVar69 = 0;
      if (lVar26 == -1) {
        pRVar28 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar28 = (cpi->common).ref_frame_map[lVar26];
      }
      pYVar30 = &pRVar28->buf;
      if (pRVar28 == (RefCntBuffer *)0x0) {
        pYVar30 = (YV12_BUFFER_CONFIG *)0x0;
      }
      psVar31 = (cpi->common).ref_scale_factors + iVar48;
      psVar50 = psVar31;
      if (iVar48 == -1) {
        psVar50 = (scale_factors *)0x0;
      }
      piVar33 = &(x->e_mbd).plane[1].subsampling_x;
      pbVar57 = &x->plane[1].src;
      lVar26 = 0;
      uVar64 = 0;
      do {
        iVar24 = *piVar33;
        iVar23 = piVar33[1];
        uVar85 = (ulong)av1_ss_size_lookup[uVar80][iVar24][iVar23];
        if (uVar85 != 0xff) {
          if (uVar10 == 0) {
            if (pMVar16->ref_frame[0] == '\x01') {
              pAVar32 = cpi->ppi;
              puVar65 = pbVar57->buf;
              iVar24 = pbVar57->stride;
              puVar82 = ((buf_2d *)(piVar33 + 0xb))->buf;
              iVar23 = piVar33[0x11];
            }
            else {
              BVar7 = (*(x->e_mbd).mi)->bsize;
              uVar81 = (x->e_mbd).mi_row;
              uVar83 = (x->e_mbd).mi_col;
              uVar70 = (uint)(0x20005L >> (BVar7 & 0x3f)) & uVar81 & 1;
              if (iVar23 == 0) {
                uVar70 = 0;
              }
              uVar78 = (uint)(0x10003L >> (BVar7 & 0x3f)) & uVar83 & 1;
              if (iVar24 == 0) {
                uVar78 = 0;
              }
              iVar61 = (int)((uVar83 - uVar78) * 4) >> ((byte)iVar24 & 0x1f);
              iVar24 = (int)((uVar81 - uVar70) * 4) >> ((byte)iVar23 & 0x1f);
              if (iVar48 != -1) {
                iVar23 = psVar31->x_scale_fp;
                if ((long)iVar23 != -1) {
                  iVar103 = psVar50->y_scale_fp;
                  if (((long)iVar103 != -1) && ((iVar23 != 0x4000 || (iVar103 != 0x4000)))) {
                    lVar51 = (long)(iVar23 * 8 + -0x20000) + (long)iVar61 * (long)iVar23;
                    if (lVar51 < 0) {
                      iVar61 = -(int)((ulong)(0x80 - lVar51) >> 8);
                    }
                    else {
                      iVar61 = (int)((ulong)(lVar51 + 0x80) >> 8);
                    }
                    lVar51 = (long)(iVar103 * 8 + -0x20000) + (long)iVar24 * (long)iVar103;
                    if (lVar51 < 0) {
                      iVar24 = -(int)((ulong)(0x80 - lVar51) >> 8);
                    }
                    else {
                      iVar24 = (int)((ulong)(lVar51 + 0x80) >> 8);
                    }
                    iVar61 = iVar61 >> 6;
                    iVar24 = iVar24 >> 6;
                  }
                }
              }
              iVar23 = (pYVar27->field_4).field_0.uv_stride;
              puVar82 = pYVar27->store_buf_adr[(ulong)(lVar26 != 0) - 3] +
                        (long)iVar24 * (long)iVar23 + (long)iVar61;
              pAVar32 = cpi->ppi;
              puVar65 = pbVar57->buf;
              iVar24 = pbVar57->stride;
            }
          }
          else {
            pAVar32 = cpi->ppi;
            puVar65 = pbVar57->buf;
            iVar24 = pbVar57->stride;
            puVar82 = ((buf_2d *)(piVar33 + 3))->buf;
            iVar23 = piVar33[9];
          }
          uVar81 = (*pAVar32->fn_ptr[uVar85].sdf)(puVar65,iVar24,puVar82,iVar23);
          uv_sad[lVar26] = uVar81;
          if (uVar42 != 0xffffffff) {
            pMVar13 = *(x->e_mbd).mi;
            uVar69._0_1_ = pMVar13->bsize;
            uVar69._1_1_ = pMVar13->partition;
            uVar69._2_1_ = pMVar13->mode;
            uVar69._3_1_ = pMVar13->uv_mode;
            uVar81 = (uint)((0x20005UL >> ((ulong)uVar69 & 0x3f) & 1) != 0);
            if (piVar33[1] == 0) {
              uVar81 = 0;
            }
            uVar69 = (uint)((0x10003UL >> ((ulong)uVar69 & 0x3f) & 1) != 0);
            if (*piVar33 == 0) {
              uVar69 = 0;
            }
            iVar23 = (int)((~uVar69 & (x->e_mbd).mi_col) << 2) >> ((byte)*piVar33 & 0x1f);
            iVar24 = (int)((~uVar81 & (x->e_mbd).mi_row) << 2) >> ((byte)piVar33[1] & 0x1f);
            if (iVar48 != -1) {
              iVar61 = psVar31->x_scale_fp;
              if ((long)iVar61 != -1) {
                iVar103 = psVar50->y_scale_fp;
                if (((long)iVar103 != -1) && ((iVar61 != 0x4000 || (iVar103 != 0x4000)))) {
                  lVar51 = (long)(iVar61 * 8 + -0x20000) + (long)iVar23 * (long)iVar61;
                  if (lVar51 < 0) {
                    iVar23 = -(int)((ulong)(0x80 - lVar51) >> 8);
                  }
                  else {
                    iVar23 = (int)((ulong)(lVar51 + 0x80) >> 8);
                  }
                  lVar51 = (long)(iVar103 * 8 + -0x20000) + (long)iVar24 * (long)iVar103;
                  if (lVar51 < 0) {
                    iVar24 = -(int)((ulong)(0x80 - lVar51) >> 8);
                  }
                  else {
                    iVar24 = (int)((ulong)(lVar51 + 0x80) >> 8);
                  }
                  iVar23 = iVar23 >> 6;
                  iVar24 = iVar24 >> 6;
                }
              }
            }
            iVar61 = (pYVar29->field_4).field_0.uv_stride;
            uVar69 = (*cpi->ppi->fn_ptr[uVar85].sdf)
                               (pbVar57->buf,pbVar57->stride,
                                pYVar29->store_buf_adr[(ulong)(lVar26 != 0) - 3] +
                                (long)iVar24 * (long)iVar61 + (long)iVar23,iVar61);
          }
          if (uVar20 != 0xffffffff) {
            pMVar13 = *(x->e_mbd).mi;
            uVar64._0_1_ = pMVar13->bsize;
            uVar64._1_1_ = pMVar13->partition;
            uVar64._2_1_ = pMVar13->mode;
            uVar64._3_1_ = pMVar13->uv_mode;
            uVar81 = (uint)((0x20005UL >> ((ulong)uVar64 & 0x3f) & 1) != 0);
            if (piVar33[1] == 0) {
              uVar81 = 0;
            }
            uVar64 = (uint)((0x10003UL >> ((ulong)uVar64 & 0x3f) & 1) != 0);
            if (*piVar33 == 0) {
              uVar64 = 0;
            }
            iVar23 = (int)((~uVar64 & (x->e_mbd).mi_col) << 2) >> ((byte)*piVar33 & 0x1f);
            iVar24 = (int)((~uVar81 & (x->e_mbd).mi_row) << 2) >> ((byte)piVar33[1] & 0x1f);
            if (iVar48 != -1) {
              iVar61 = psVar31->x_scale_fp;
              if ((long)iVar61 != -1) {
                iVar103 = psVar50->y_scale_fp;
                if (((long)iVar103 != -1) && ((iVar61 != 0x4000 || (iVar103 != 0x4000)))) {
                  lVar51 = (long)(iVar61 * 8 + -0x20000) + (long)iVar23 * (long)iVar61;
                  if (lVar51 < 0) {
                    iVar23 = -(int)((ulong)(0x80 - lVar51) >> 8);
                  }
                  else {
                    iVar23 = (int)((ulong)(lVar51 + 0x80) >> 8);
                  }
                  lVar51 = (long)(iVar103 * 8 + -0x20000) + (long)iVar24 * (long)iVar103;
                  if (lVar51 < 0) {
                    iVar24 = -(int)((ulong)(0x80 - lVar51) >> 8);
                  }
                  else {
                    iVar24 = (int)((ulong)(lVar51 + 0x80) >> 8);
                  }
                  iVar23 = iVar23 >> 6;
                  iVar24 = iVar24 >> 6;
                }
              }
            }
            iVar61 = (pYVar30->field_4).field_0.uv_stride;
            uVar64 = (*cpi->ppi->fn_ptr[uVar85].sdf)
                               (pbVar57->buf,pbVar57->stride,
                                pYVar30->store_buf_adr[(ulong)(lVar26 != 0) - 3] +
                                (long)iVar24 * (long)iVar61 + (long)iVar23,iVar61);
          }
        }
        if (uVar49 >> sVar38 < uv_sad[lVar26]) {
          x->color_sensitivity_sb[lVar26] = '\x01';
        }
        else if (uv_sad[lVar26] < uVar49 >> bVar39) {
          x->color_sensitivity_sb[lVar26] = '\0';
        }
        else {
          x->color_sensitivity_sb[lVar26] = '\x02';
        }
        x->color_sensitivity_sb_g[lVar26] = (uint)(uVar75 / uVar54) < uVar69;
        x->color_sensitivity_sb_alt[lVar26] = uVar20 / uVar54 < uVar64;
        lVar26 = lVar26 + 1;
        piVar33 = piVar33 + 0x28c;
        pbVar57 = (buf_2d *)((long)(pbVar57 + 4) + 8);
      } while (lVar26 != 2);
    }
  }
  x->force_zeromv_skip_for_sb = 0;
  piVar33 = (int *)aom_malloc(0x58);
  if (piVar33 == (int *)0x0) {
    aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,"Failed to allocate vt");
  }
  *(VP64x64 **)(piVar33 + 0x14) = td->vt64x64;
  if ((((bVar86 == false) && (iVar48 = (cpi->sf).rt_sf.part_early_exit_zeromv, iVar48 != 0)) &&
      (local_339 == '\x01')) &&
     (((0x1e < (cpi->rc).frames_since_key && (local_260 = (short)uVar60, local_260 == 0)) &&
      (((*(x->e_mbd).mi)->mv[0].as_int == 0 &&
       (iVar24 = (cpi->sf).rt_sf.set_zeromv_skip_based_on_source_sad, iVar24 != 0)))))) {
    SVar11 = (x->content_state_sb).source_sad_nonrd;
    if (iVar24 < 3) {
      if (iVar24 == 2) {
        if (SVar11 < kLowSad) {
LAB_0025342c:
          BVar7 = ((cpi->common).seq_params)->sb_size;
          if ((int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [BVar7] + mi_col) <= tile->mi_col_end) {
            bVar88 = (cpi->sf).rt_sf.increase_source_sad_thresh != 0;
            uVar20 = cpi->zeromv_skip_thresh_exit_part[uVar80] << bVar88;
            uVar42 = (uVar20 * 3 >> 2) << bVar88;
            uVar60 = uVar42 >> 3;
            if (iVar48 != 1) {
              uVar60 = uVar42;
            }
            if (SVar11 == kZeroSad) {
              uVar60 = uVar42;
            }
            if ((((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [BVar7] + mi_row) <= tile->mi_row_end) && (uVar55 < uVar20)) &&
               ((uv_sad[0] < uVar60 && (uv_sad[1] < uVar60)))) {
              if ((mi_col < (cpi->common).mi_params.mi_cols) &&
                 (mi_row < (cpi->common).mi_params.mi_rows)) {
                iVar68 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                              [(cpi->common).mi_params.mi_alloc_bsize]) *
                         (cpi->common).mi_params.mi_alloc_stride +
                         mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                             [(cpi->common).mi_params.mi_alloc_bsize];
                pMVar16 = (cpi->common).mi_params.mi_alloc;
                (cpi->common).mi_params.mi_grid_base
                [(cpi->common).mi_params.mi_stride * mi_row + mi_col] = pMVar16 + iVar68;
                pMVar16[iVar68].bsize = (BLOCK_SIZE)uVar80;
              }
              x->force_zeromv_skip_for_sb = 1;
              goto LAB_002533a8;
            }
          }
          if (1 < iVar48 && SVar11 == kZeroSad) {
            x->force_zeromv_skip_for_sb = 2;
          }
        }
      }
      else if (SVar11 == kZeroSad && 0 < iVar24) goto LAB_0025342c;
    }
    else if (SVar11 < kMedSad) goto LAB_0025342c;
  }
  if ((cpi->noise_estimate).enabled == 0) {
    local_1f8 = 0;
  }
  else {
    NVar22 = av1_noise_estimate_extract_level(&cpi->noise_estimate);
    local_1f8 = CONCAT71((int7)(CONCAT44(extraout_var,NVar22) >> 8),kLow < NVar22);
  }
  puVar65 = (x->part_search_info).variance_low;
  iVar23 = (uint)(BVar4 != BLOCK_64X64) * 0x40;
  iVar48 = (x->e_mbd).mb_to_right_edge;
  iVar24 = (x->e_mbd).mb_to_bottom_edge;
  iVar61 = (iVar48 >> 0x1f & iVar48 >> 3) + iVar23 + 0x40;
  iVar48 = (iVar24 >> 0x1f & iVar24 >> 3) + iVar23 + 0x40;
  uVar80 = (uint)(byte)(~bVar86 & (cpi->sf).rt_sf.use_rtc_tf != 0);
  lVar26 = 0xf8;
  lVar51 = 0x148;
  local_208 = 0;
  do {
    uVar75 = local_208;
    local_1fc = ((uint)local_208 & 1) << 6;
    local_200 = ((uint)local_208 & 0x7fffffe) << 5;
    lVar73 = local_208 * 4;
    local_188[local_208 + 1] = '\0';
    local_1f0 = local_183 + local_208 * 4;
    lVar71 = 0;
    lVar67 = lVar26;
    local_208 = local_208 + 1;
    local_1c8 = lVar51;
    do {
      uVar60 = ((uint)lVar71 & 1) << 5 | local_1fc;
      uVar20 = ((uint)lVar71 & 2) << 4 | local_200;
      local_1f0[lVar71] = '\0';
      piVar36 = avg_16x16[uVar75] + lVar71;
      *piVar36 = 0;
      piVar76 = maxvar_16x16[uVar75] + lVar71;
      *piVar76 = 0;
      piVar1 = minvar_16x16[uVar75] + lVar71;
      *piVar1 = 0x7fffffff;
      lVar79 = (lVar73 + lVar71) * 4 + -0x173;
      lVar66 = 0;
      lVar63 = lVar51;
      lVar72 = lVar67;
      do {
        uVar49 = ((uint)lVar66 & 1) << 4 | uVar60;
        uVar42 = uVar20 + ((uint)lVar66 & 2) * 8;
        lVar34 = *(long *)(piVar33 + 0x14);
        aPStack_173[lVar66 + lVar79 + 0x173] = '\0';
        if (bVar86 == false) {
          if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
            sse[0] = 0;
            sse[1] = 0;
            sse[2] = 0;
            sse[3] = 0;
            sum = (int  [4])ZEXT816(0);
            bVar88 = true;
            uVar54 = 0;
            uVar55 = 0;
            do {
              if (iVar61 <= (int)(uVar55 & 8 | uVar49)) {
                bVar88 = false;
              }
              if (iVar48 <= (int)(uVar54 & 8 | uVar42)) {
                bVar88 = false;
              }
              uVar55 = uVar55 + 8;
              uVar54 = uVar54 + 4;
            } while (uVar55 != 0x20);
            if (bVar88) {
              (*aom_avg_8x8_quad)(puVar56,iVar68,uVar49,uVar42,src_avg);
              (*aom_avg_8x8_quad)(local_2c0,iVar102,uVar49,uVar42,&local_128);
              iVar89 = src_avg[0] - local_128;
              iVar94 = src_avg[1] - iStack_124;
              iVar95 = src_avg[2] - iStack_120;
              iVar96 = src_avg[3] - iStack_11c;
              sum[0] = iVar89;
              sum[1] = iVar94;
              sum[2] = iVar95;
              sum[3] = iVar96;
              auVar97._4_4_ = iVar94;
              auVar97._0_4_ = iVar94;
              auVar97._8_4_ = iVar96;
              auVar97._12_4_ = iVar96;
              uVar90 = iVar89 * iVar89;
              sse[0] = uVar90;
              sse[1] = iVar94 * iVar94;
              local_1c8 = CONCAT44((int)((auVar97._8_8_ & 0xffffffff) * (auVar97._8_8_ & 0xffffffff)
                                        ),iVar95 * iVar95);
            }
            else {
              uVar55 = 0;
              lVar84 = 0;
              do {
                uVar54 = uVar55 & 8 | uVar49;
                if (((int)uVar54 < iVar61) &&
                   (uVar69 = (uint)lVar84 & 8 | uVar42, (int)uVar69 < iVar48)) {
                  uVar64 = aom_avg_8x8_sse2(puVar56 + (long)(int)(uVar69 * iVar68) + (ulong)uVar54,
                                            iVar68);
                  uVar54 = aom_avg_8x8_sse2(local_2c0 +
                                            (long)(int)(uVar69 * iVar102) + (ulong)uVar54,iVar102);
                  iVar24 = uVar64 - uVar54;
                  *(int *)((long)sum + lVar84) = iVar24;
                  *(int *)((long)sse + lVar84) = iVar24 * iVar24;
                }
                lVar84 = lVar84 + 4;
                uVar55 = uVar55 + 8;
              } while (lVar84 != 0x10);
            }
            puVar58 = (undefined4 *)(lVar72 + lVar34);
            lVar84 = 0;
            do {
              iVar24 = sum[lVar84];
              puVar58[-2] = sse[lVar84];
              puVar58[-1] = iVar24;
              *puVar58 = 0;
              lVar84 = lVar84 + 1;
              puVar58 = puVar58 + 0xa4;
            } while (lVar84 != 4);
          }
          else {
            puVar58 = (undefined4 *)(lVar72 + lVar34);
            uVar55 = 0;
            lVar84 = 0;
            do {
              uVar54 = uVar55 & 8 | uVar49;
              iVar24 = 0;
              iVar23 = 0;
              if (((int)uVar54 < iVar61) &&
                 (uVar69 = (uint)lVar84 & 8 | uVar42, (int)uVar69 < iVar48)) {
                uVar64 = aom_highbd_avg_8x8_c
                                   (puVar56 + (long)(int)(uVar69 * iVar68) + (ulong)uVar54,iVar68);
                uVar54 = aom_highbd_avg_8x8_c
                                   (local_2c0 + (long)(int)(uVar69 * iVar102) + (ulong)uVar54,
                                    iVar102);
                iVar24 = uVar64 - uVar54;
                iVar23 = iVar24 * iVar24;
              }
              puVar58[-2] = iVar23;
              puVar58[-1] = iVar24;
              *puVar58 = 0;
              lVar84 = lVar84 + 4;
              puVar58 = puVar58 + 0xa4;
              uVar55 = uVar55 + 8;
            } while (lVar84 != 0x10);
          }
          lVar84 = lVar66 * 0xa90;
          lVar34 = lVar34 + uVar75 * 0xaa90 + lVar71 * 0x2a90 + lVar84;
          puVar15 = (undefined8 *)(lVar34 + 0xf0);
          auVar92._8_4_ = (int)puVar15;
          auVar92._0_8_ = puVar15;
          auVar92._12_4_ = (int)((ulong)puVar15 >> 0x20);
          lVar77 = auVar92._8_8_;
          uVar2 = *(undefined8 *)(lVar77 + 0x290);
          *(ulong *)(lVar34 + 0xb0) =
               CONCAT44((int)((ulong)*puVar15 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                        (int)*puVar15 + (int)uVar2);
          *(int *)(lVar34 + 0xb8) = *(int *)(lVar34 + 0xf8) + 1;
          uVar2 = *(undefined8 *)(lVar77 + 0x7b0);
          uVar3 = *(undefined8 *)(lVar34 + 0x610);
          *(ulong *)(lVar34 + 0xc0) =
               CONCAT44((int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                        (int)uVar3 + (int)uVar2);
          *(int *)(lVar34 + 200) = *(int *)(lVar34 + 0x618) + 1;
          *(int *)(lVar34 + 0xd8) = *(int *)(lVar34 + 0xf8) + 1;
          *(int *)(lVar34 + 0xe8) = *(int *)(lVar77 + 0x298) + 1;
          uVar2 = *(undefined8 *)(lVar34 + 0x610);
          iVar24 = (int)*puVar15 + (int)uVar2;
          iVar23 = (int)((ulong)*puVar15 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
          *(ulong *)(lVar34 + 0xd0) = CONCAT44(iVar23,iVar24);
          uVar2 = *(undefined8 *)(lVar77 + 0x7b0);
          uVar3 = *(undefined8 *)(lVar77 + 0x290);
          iVar103 = (int)uVar3 + (int)uVar2;
          iVar43 = (int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
          *(ulong *)(lVar34 + 0xe0) = CONCAT44(iVar43,iVar103);
          *(ulong *)(lVar34 + 0xa0) = CONCAT44(iVar43 + iVar23,iVar103 + iVar24);
          *(int *)(lVar34 + 0xa8) = *(int *)(lVar34 + 0xf8) + 2;
          lVar34 = uVar75 * 0xaa90 + *(long *)(piVar33 + 0x14) + lVar71 * 0x2a90;
          lVar77 = (long)*(int *)(lVar84 + 0xa4 + lVar34);
          bVar39 = *(byte *)(lVar84 + 0xa8 + lVar34);
          uVar49 = (uint)((*(int *)(lVar84 + 0xa0 + lVar34) -
                          (int)((ulong)(lVar77 * lVar77) >> (bVar39 & 0x3f))) * 0x100) >>
                   (bVar39 & 0x1f);
          *(uint *)(lVar84 + 0xac + lVar34) = uVar49;
          *piVar36 = *piVar36 + uVar49;
          uVar42 = *piVar1;
          if ((int)uVar49 <= *piVar1) {
            uVar42 = uVar49;
          }
          *piVar1 = uVar42;
          uVar42 = *piVar76;
          if (*piVar76 <= (int)uVar49) {
            uVar42 = uVar49;
          }
          *piVar76 = uVar42;
          if (iStack_220 < (int)uVar49) {
            aPStack_173[lVar66 + lVar79 + 0x173] = '\x01';
            local_1f0[lVar71] = '\x01';
            local_188[local_208] = '\x01';
            local_188[0] = '\x01';
          }
        }
        else {
          puVar58 = (undefined4 *)(lVar34 + lVar63);
          lVar34 = 0;
          do {
            uVar55 = ((x->e_mbd).cur_buf)->flags;
            uVar54 = 0;
            lVar84 = 0;
            puVar59 = puVar58;
            do {
              uVar69 = uVar54 & 4 | (int)lVar34 * 8 & 8U | uVar49;
              iVar23 = 0;
              iVar24 = 0;
              if (((int)uVar69 < (int)(iVar61 + uVar80 * -4)) &&
                 (uVar64 = (uint)lVar84 & 4 | (int)lVar34 * 4 & 8U | uVar42,
                 (int)uVar64 < (int)(iVar48 + uVar80 * -4))) {
                if ((uVar55 & 8) == 0) {
                  uVar69 = aom_avg_4x4_sse2(puVar56 + (long)(int)(uVar64 * iVar68) + (ulong)uVar69,
                                            iVar68);
                }
                else {
                  uVar69 = aom_highbd_avg_4x4_c
                                     (puVar56 + (long)(int)(uVar64 * iVar68) + (ulong)uVar69,iVar68)
                  ;
                }
                iVar24 = uVar69 - 0x80;
                iVar23 = iVar24 * iVar24;
              }
              puVar59[-2] = iVar23;
              puVar59[-1] = iVar24;
              *puVar59 = 0;
              lVar84 = lVar84 + 2;
              puVar59 = puVar59 + 0x24;
              uVar54 = uVar54 + 4;
            } while (lVar84 != 8);
            lVar34 = lVar34 + 1;
            puVar58 = puVar58 + 0xa4;
          } while (lVar34 != 4);
        }
        threshold_01 = iStack_220;
        lVar66 = lVar66 + 1;
        lVar72 = lVar72 + 0xa90;
        lVar63 = lVar63 + 0xa90;
      } while (lVar66 != 4);
      lVar71 = lVar71 + 1;
      lVar67 = lVar67 + 0x2a90;
      lVar51 = lVar51 + 0x2a90;
    } while (lVar71 != 4);
    if (BVar4 == BLOCK_64X64) break;
    lVar26 = lVar26 + 0xaa90;
    lVar51 = local_1c8 + 0xaa90;
  } while (uVar75 < 3);
  lVar26 = (ulong)(BVar4 != BLOCK_64X64) * 3 + 1;
  puVar15 = *(undefined8 **)(piVar33 + 0x14);
  local_278 = 0x7fffffff;
  lVar67 = 0;
  lVar73 = 0x140;
  iVar68 = 0;
  uVar80 = 0;
  lVar51 = 0;
  do {
    lVar71 = lVar51 + 1;
    uVar60 = 0x7fffffff;
    uVar20 = 0;
    lVar72 = 0;
    lVar79 = lVar73;
    lVar63 = lVar67;
    do {
      lVar66 = lVar51 * 4 + 5 + lVar72;
      lVar77 = 0;
      lVar34 = lVar79;
      lVar84 = lVar63;
      do {
        if (bVar86 != false) {
          lVar74 = *(long *)(piVar33 + 0x14);
          lVar44 = lVar72 * 0x2a90 + lVar51 * 0xaa90 + lVar74;
          lVar53 = lVar77 * 0xa90 + lVar44;
          lVar44 = lVar44 + lVar77 * 0xa90;
          puVar45 = (undefined8 *)(lVar44 + 0xf0);
          puVar52 = (undefined8 *)(lVar74 + lVar34);
          lVar35 = 4;
          do {
            auVar98._8_4_ = (int)puVar52;
            auVar98._0_8_ = puVar52;
            auVar98._12_4_ = (int)((ulong)puVar52 >> 0x20);
            lVar104 = auVar98._8_8_;
            uVar2 = *(undefined8 *)(lVar104 + 0x90);
            puVar52[-8] = CONCAT44((int)((ulong)*puVar52 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                                   (int)*puVar52 + (int)uVar2);
            *(int *)(puVar52 + -7) = *(int *)(puVar52 + 1) + 1;
            uVar2 = *(undefined8 *)(lVar104 + 0x1b0);
            uVar3 = puVar52[0x24];
            puVar52[-6] = CONCAT44((int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                                   (int)uVar3 + (int)uVar2);
            *(int *)(puVar52 + -5) = *(int *)(puVar52 + 0x25) + 1;
            *(int *)(puVar52 + -3) = *(int *)(puVar52 + 1) + 1;
            *(int *)(puVar52 + -1) = *(int *)(lVar104 + 0x98) + 1;
            uVar2 = puVar52[0x24];
            iVar102 = (int)*puVar52 + (int)uVar2;
            iVar48 = (int)((ulong)*puVar52 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
            puVar52[-4] = CONCAT44(iVar48,iVar102);
            uVar2 = *(undefined8 *)(lVar104 + 0x1b0);
            uVar3 = *(undefined8 *)(lVar104 + 0x90);
            iVar24 = (int)uVar3 + (int)uVar2;
            iVar23 = (int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
            puVar52[-2] = CONCAT44(iVar23,iVar24);
            puVar52[-10] = CONCAT44(iVar23 + iVar48,iVar24 + iVar102);
            *(int *)(puVar52 + -9) = *(int *)(puVar52 + 1) + 2;
            puVar52 = puVar52 + 0x52;
            lVar35 = lVar35 + -1;
          } while (lVar35 != 0);
          auVar99._8_4_ = (int)puVar45;
          auVar99._0_8_ = puVar45;
          auVar99._12_4_ = (int)((ulong)puVar45 >> 0x20);
          lVar35 = auVar99._8_8_;
          uVar2 = *(undefined8 *)(lVar35 + 0x290);
          *(ulong *)(lVar53 + 0xb0) =
               CONCAT44((int)((ulong)*puVar45 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                        (int)*puVar45 + (int)uVar2);
          *(int *)(lVar53 + 0xb8) = *(int *)(lVar44 + 0xf8) + 1;
          uVar2 = *(undefined8 *)(lVar35 + 0x7b0);
          uVar3 = *(undefined8 *)(lVar44 + 0x610);
          *(ulong *)(lVar53 + 0xc0) =
               CONCAT44((int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                        (int)uVar3 + (int)uVar2);
          *(int *)(lVar53 + 200) = *(int *)(lVar44 + 0x618) + 1;
          uVar2 = *(undefined8 *)(lVar44 + 0x610);
          iVar48 = (int)*puVar45 + (int)uVar2;
          iVar24 = (int)((ulong)*puVar45 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
          *(ulong *)(lVar53 + 0xd0) = CONCAT44(iVar24,iVar48);
          *(int *)(lVar53 + 0xd8) = *(int *)(lVar44 + 0xf8) + 1;
          iVar102 = *(int *)(lVar35 + 0x298);
          uVar2 = *(undefined8 *)(lVar35 + 0x7b0);
          uVar3 = *(undefined8 *)(lVar35 + 0x290);
          iVar23 = (int)uVar3 + (int)uVar2;
          iVar61 = (int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
          *(ulong *)(lVar53 + 0xe0) = CONCAT44(iVar61,iVar23);
          *(int *)(lVar53 + 0xe8) = iVar102 + 1;
          iVar23 = iVar23 + iVar48;
          iVar61 = iVar61 + iVar24;
          iVar102 = *(int *)(lVar44 + 0xf8) + 2;
          bVar39 = (byte)iVar102;
          *(int *)(lVar53 + 0xa0) = iVar23;
          *(int *)(lVar53 + 0xa4) = iVar61;
          uVar42 = (uint)((iVar23 - (int)((ulong)((long)iVar61 * (long)iVar61) >> (bVar39 & 0x3f)))
                         * 0x100) >> (bVar39 & 0x1f);
          *(int *)(lVar53 + 0xa8) = iVar102;
          *(uint *)(lVar53 + 0xac) = uVar42;
          if (iStack_220 < (int)uVar42) {
            PVar19 = '\x01';
            if ((cpi->sf).rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var == true) {
              lVar74 = lVar74 + lVar84;
              uVar49 = 0x7fffffff;
              uVar42 = 0;
              lVar53 = 0xfc;
              do {
                lVar35 = (long)*(int *)(lVar74 + -8 + lVar53);
                bVar39 = *(byte *)(lVar74 + -4 + lVar53);
                uVar55 = (uint)((*(int *)(lVar74 + -0xc + lVar53) -
                                (int)((ulong)(lVar35 * lVar35) >> (bVar39 & 0x3f))) * 0x100) >>
                         (bVar39 & 0x1f);
                *(uint *)(lVar74 + lVar53) = uVar55;
                if ((int)uVar42 < (int)uVar55) {
                  uVar42 = uVar55;
                }
                if ((int)uVar49 <= (int)uVar55) {
                  uVar55 = uVar49;
                }
                uVar49 = uVar55;
                lVar53 = lVar53 + 0x290;
              } while (lVar53 != 0xb3c);
              PVar19 = '\x02' - (iStack_220 * 4 < (long)(int)(uVar42 - uVar49));
            }
            aPStack_173[(lVar51 * 4 + lVar72) * 4 + lVar77] = PVar19;
            local_183[lVar66 + -5] = '\x01';
            local_188[0] = '\x01';
            local_188[lVar51 + 1] = '\x01';
          }
        }
        lVar77 = lVar77 + 1;
        lVar34 = lVar34 + 0xa90;
        lVar84 = lVar84 + 0xa90;
      } while (lVar77 != 4);
      puVar52 = puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0x14;
      auVar100._8_4_ = (int)puVar52;
      auVar100._0_8_ = puVar52;
      auVar100._12_4_ = (int)((ulong)puVar52 >> 0x20);
      lVar34 = auVar100._8_8_;
      iVar102 = *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0x15);
      uVar2 = *(undefined8 *)(lVar34 + 0xa90);
      puVar15[lVar51 * 0x1552 + lVar72 * 0x552 + 0xc] =
           CONCAT44((int)((ulong)*puVar52 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                    (int)*puVar52 + (int)uVar2);
      *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0xd) = iVar102 + 1;
      iVar102 = *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0x2b9);
      uVar2 = *(undefined8 *)(lVar34 + 0x1fb0);
      uVar3 = puVar15[lVar51 * 0x1552 + lVar72 * 0x552 + 0x2b8];
      puVar15[lVar51 * 0x1552 + lVar72 * 0x552 + 0xe] =
           CONCAT44((int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                    (int)uVar3 + (int)uVar2);
      *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0xf) = iVar102 + 1;
      iVar102 = *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0x15);
      uVar2 = puVar15[lVar51 * 0x1552 + lVar72 * 0x552 + 0x2b8];
      iVar24 = (int)*puVar52 + (int)uVar2;
      iVar103 = (int)((ulong)*puVar52 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
      puVar15[lVar51 * 0x1552 + lVar72 * 0x552 + 0x10] = CONCAT44(iVar103,iVar24);
      *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0x11) = iVar102 + 1;
      iVar48 = *(int *)(lVar34 + 0xa98);
      uVar2 = *(undefined8 *)(lVar34 + 0x1fb0);
      uVar3 = *(undefined8 *)(lVar34 + 0xa90);
      iVar23 = (int)uVar3 + (int)uVar2;
      iVar61 = (int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
      puVar15[lVar51 * 0x1552 + lVar72 * 0x552 + 0x12] = CONCAT44(iVar61,iVar23);
      *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0x13) = iVar48 + 1;
      iVar23 = iVar23 + iVar24;
      iVar61 = iVar61 + iVar103;
      iVar102 = iVar102 + 2;
      *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 10) = iVar23;
      *(int *)((long)puVar15 + lVar72 * 0x2a90 + lVar51 * 0xaa90 + 0x54) = iVar61;
      *(int *)(puVar15 + lVar51 * 0x1552 + lVar72 * 0x552 + 0xb) = iVar102;
      iVar48 = (cpi->common).height;
      iVar24 = (cpi->common).width;
      uVar75 = 20000;
      if ((2 < (cpi->svc).number_temporal_layers) && ((cpi->svc).temporal_layer_id == 0)) {
        uVar75 = 40000;
      }
      if (local_183[lVar66 + -5] == '\0') {
        bVar39 = (byte)iVar102;
        uVar42 = (uint)((iVar23 - (int)((ulong)((long)iVar61 * (long)iVar61) >> (bVar39 & 0x3f))) *
                       0x100) >> (bVar39 & 0x1f);
        *(uint *)((long)puVar15 + lVar72 * 0x2a90 + lVar51 * 0xaa90 + 0x5c) = uVar42;
        if ((int)uVar20 < (int)uVar42) {
          uVar20 = uVar42;
        }
        if ((int)uVar42 < (int)uVar60) {
          uVar60 = uVar42;
        }
        if (local_228 < (int)uVar42) {
LAB_0025263e:
          local_183[lVar66 + -5] = '\x01';
          local_188[0] = '\x01';
          local_188[lVar51 + 1] = '\x01';
        }
        else if (bVar86 == false) {
          iVar102 = maxvar_16x16[lVar51][lVar72];
          lVar34 = (long)iVar102;
          iVar23 = minvar_16x16[lVar51][lVar72];
          if (((local_228 >> 1 < (long)(int)uVar42) &&
              (avg_16x16[lVar51][lVar72] >> 1 < (int)uVar42)) ||
             ((iVar48 * iVar24 < 0x38401 &&
              ((local_228 >> 1 < lVar34 - iVar23 && local_228 < lVar34 ||
               (((((cpi->sf).rt_sf.prefer_large_partition_blocks != 0 &&
                  (kLowSad < (x->content_state_sb).source_sad_nonrd)) &&
                 ((cpi->rc).frame_source_sad < uVar75)) &&
                ((local_228 >> 4 < lVar34 &&
                 (iVar102 != iVar23 * 4 && SBORROW4(iVar102,iVar23 * 4) == iVar102 + iVar23 * -4 < 0
                 )))))))))) goto LAB_0025263e;
        }
      }
      lVar72 = lVar72 + 1;
      lVar79 = lVar79 + 0x2a90;
      lVar63 = lVar63 + 0x2a90;
    } while (lVar72 != 4);
    if (local_188[lVar51 + 1] == '\0') {
      piVar36 = (int *)(puVar15 + lVar51 * 0x1552);
      piVar76 = piVar36 + 0x14;
      auVar101._8_4_ = (int)piVar76;
      auVar101._0_8_ = piVar76;
      auVar101._12_4_ = (int)((ulong)piVar76 >> 0x20);
      lVar79 = auVar101._8_8_;
      uVar2 = *(undefined8 *)(lVar79 + 0x2a90);
      *(ulong *)(piVar36 + 4) =
           CONCAT44((int)((ulong)*(undefined8 *)piVar76 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                    (int)*(undefined8 *)piVar76 + (int)uVar2);
      piVar36[6] = piVar36[0x16] + 1;
      uVar2 = *(undefined8 *)(lVar79 + 0x7fb0);
      uVar3 = *(undefined8 *)(piVar36 + 0x155c);
      *(ulong *)(piVar36 + 8) =
           CONCAT44((int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                    (int)uVar3 + (int)uVar2);
      piVar36[10] = piVar36[0x155e] + 1;
      uVar2 = *(undefined8 *)(piVar36 + 0x155c);
      iVar48 = (int)*(undefined8 *)piVar76 + (int)uVar2;
      iVar24 = (int)((ulong)*(undefined8 *)piVar76 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
      *(ulong *)(piVar36 + 0xc) = CONCAT44(iVar24,iVar48);
      piVar36[0xe] = piVar36[0x16] + 1;
      iVar102 = *(int *)(lVar79 + 0x2a98);
      uVar2 = *(undefined8 *)(lVar79 + 0x7fb0);
      uVar3 = *(undefined8 *)(lVar79 + 0x2a90);
      iVar23 = (int)uVar3 + (int)uVar2;
      iVar61 = (int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
      *(ulong *)(piVar36 + 0x10) = CONCAT44(iVar61,iVar23);
      piVar36[0x12] = iVar102 + 1;
      iVar23 = iVar23 + iVar48;
      iVar61 = iVar61 + iVar24;
      iVar102 = piVar36[0x16] + 2;
      *piVar36 = iVar23;
      bVar39 = (byte)iVar102;
      piVar36[1] = iVar61;
      piVar36[2] = iVar102;
      uVar42 = (uint)((iVar23 - (int)((ulong)((long)iVar61 * (long)iVar61) >> (bVar39 & 0x3f))) *
                     0x100) >> (bVar39 & 0x1f);
      piVar36[3] = uVar42;
      if ((int)uVar80 < (int)uVar42) {
        uVar80 = uVar42;
      }
      if ((int)uVar42 < (int)local_278) {
        local_278 = uVar42;
      }
      if ((char)local_1f8 == '\0') {
        if (cpi->ppi->use_svc == 0) {
          bVar88 = (cpi->sf).rt_sf.prefer_large_partition_blocks == 0;
        }
        else {
          bVar88 = false;
        }
      }
      else {
        bVar88 = false;
      }
      if ((bVar86 == false) &&
         ((iStack_230 >> 1 < (long)(ulong)uVar20 && !bVar88) &&
          (iStack_230 >> 3) * 3 < (long)(int)(uVar20 - uVar60))) {
        local_188[lVar51 + 1] = '\x01';
        local_188[0] = '\x01';
      }
      iVar68 = iVar68 + uVar42;
    }
    if (BVar4 == BLOCK_64X64) {
      local_188[0] = '\x01';
    }
    lVar73 = lVar73 + 0xaa90;
    lVar67 = lVar67 + 0xaa90;
    lVar51 = lVar71;
  } while (lVar71 != lVar26);
  PVar19 = local_188[0];
  if (local_188[0] == '\0') {
    auVar93._8_4_ = (int)puVar15;
    auVar93._0_8_ = puVar15;
    auVar93._12_4_ = (int)((ulong)puVar15 >> 0x20);
    lVar51 = auVar93._8_8_;
    iVar102 = *(int *)(puVar15 + 1);
    uVar2 = *(undefined8 *)(lVar51 + 0xaa90);
    *(ulong *)(piVar33 + 4) =
         CONCAT44((int)((ulong)*puVar15 >> 0x20) + (int)((ulong)uVar2 >> 0x20),
                  (int)*puVar15 + (int)uVar2);
    piVar33[6] = iVar102 + 1;
    iVar102 = *(int *)(puVar15 + 0x2aa5);
    uVar2 = *(undefined8 *)(lVar51 + 0x1ffb0);
    uVar3 = puVar15[0x2aa4];
    *(ulong *)(piVar33 + 8) =
         CONCAT44((int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20),(int)uVar3 + (int)uVar2)
    ;
    piVar33[10] = iVar102 + 1;
    iVar102 = *(int *)(puVar15 + 1);
    uVar2 = puVar15[0x2aa4];
    iVar24 = (int)*puVar15 + (int)uVar2;
    iVar23 = (int)((ulong)*puVar15 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
    *(ulong *)(piVar33 + 0xc) = CONCAT44(iVar23,iVar24);
    piVar33[0xe] = iVar102 + 1;
    iVar48 = *(int *)(lVar51 + 0xaa98);
    uVar2 = *(undefined8 *)(lVar51 + 0x1ffb0);
    uVar3 = *(undefined8 *)(lVar51 + 0xaa90);
    iVar61 = (int)uVar3 + (int)uVar2;
    iVar103 = (int)((ulong)uVar3 >> 0x20) + (int)((ulong)uVar2 >> 0x20);
    *(ulong *)(piVar33 + 0x10) = CONCAT44(iVar103,iVar61);
    piVar33[0x12] = iVar48 + 1;
    iVar61 = iVar61 + iVar24;
    iVar103 = iVar103 + iVar23;
    iVar102 = iVar102 + 2;
    bVar39 = (byte)iVar102;
    *piVar33 = iVar61;
    uVar60 = (uint)((iVar61 - (int)((ulong)((long)iVar103 * (long)iVar103) >> (bVar39 & 0x3f))) *
                   0x100) >> (bVar39 & 0x1f);
    piVar33[1] = iVar103;
    piVar33[2] = iVar102;
    piVar33[3] = uVar60;
    if (bVar86 == false) {
      PVar19 = local_238 >> 1 < (long)(ulong)uVar80 &&
               (local_238 >> 3) * 3 < (long)(int)(uVar80 - local_278) ||
               iVar68 * 9 >> 5 < (int)uVar60;
    }
    else {
      PVar19 = '\0';
    }
  }
  if (((tile->mi_col_end < mi_col + 0x20) || (tile->mi_row_end < mi_row + 0x20)) ||
     (iVar68 = set_vt_partitioning(cpi,xd,tile,piVar33,BLOCK_128X128,mi_row,mi_col,local_238,
                                   BLOCK_16X16,PVar19), iVar68 == 0)) {
    threshold_00 = local_228;
    threshold = iStack_230;
    lVar51 = 0;
    do {
      lVar73 = lVar51 * 0xaa90;
      iVar102 = mi_row + ((uint)lVar51 & 0xfffffffe) * 8;
      iVar48 = ((uint)lVar51 & 1) * 0x10 + mi_col;
      iVar68 = set_vt_partitioning(cpi,xd,tile,(void *)(*(long *)(piVar33 + 0x14) + lVar73),
                                   BLOCK_64X64,iVar102,iVar48,threshold,BLOCK_16X16,
                                   local_188[lVar51 + 1]);
      if (iVar68 == 0) {
        lVar67 = 0;
        do {
          iVar24 = iVar102 + ((uint)lVar67 & 2) * 4;
          iVar23 = iVar48 + ((uint)lVar67 & 1) * 8;
          iVar68 = set_vt_partitioning(cpi,xd,tile,
                                       (void *)(*(long *)(piVar33 + 0x14) + lVar73 + lVar67 * 0x2a90
                                               + 0x50),BLOCK_32X32,iVar24,iVar23,threshold_00,
                                       BLOCK_16X16,local_183[lVar51 * 4 + lVar67]);
          if (iVar68 == 0) {
            lVar71 = 0;
            do {
              iVar103 = iVar24 + ((uint)lVar71 & 2) * 2;
              iVar61 = iVar23 + ((uint)lVar71 & 1) * 4;
              iVar68 = set_vt_partitioning(cpi,xd,tile,
                                           (void *)(*(long *)(piVar33 + 0x14) + lVar73 +
                                                    lVar67 * 0x2a90 + lVar71 * 0xa90 + 0xa0),
                                           BLOCK_16X16,iVar103,iVar61,threshold_01,BLOCK_8X8,
                                           aPStack_173[lVar71 + (lVar51 * 4 + lVar67) * 4]);
              if (iVar68 == 0) {
                iVar68 = (cpi->common).mi_params.mi_cols;
                uVar80 = 0;
                uVar60 = 0;
                do {
                  iVar43 = (uVar80 & 2) + iVar61;
                  if ((iVar43 < iVar68) &&
                     (iVar25 = (uVar60 & 2) + iVar103, iVar25 < (cpi->common).mi_params.mi_rows)) {
                    iVar62 = (iVar25 / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                  [(cpi->common).mi_params.mi_alloc_bsize]) *
                             (cpi->common).mi_params.mi_alloc_stride +
                             iVar43 / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                 [(cpi->common).mi_params.mi_alloc_bsize];
                    pMVar16 = (cpi->common).mi_params.mi_alloc;
                    (cpi->common).mi_params.mi_grid_base
                    [(cpi->common).mi_params.mi_stride * iVar25 + iVar43] = pMVar16 + iVar62;
                    pMVar16[iVar62].bsize = BLOCK_8X8;
                  }
                  uVar60 = uVar60 + 1;
                  uVar80 = uVar80 + 2;
                } while (uVar60 != 4);
              }
              lVar71 = lVar71 + 1;
            } while (lVar71 != 4);
          }
          lVar67 = lVar67 + 1;
        } while (lVar67 != 4);
      }
      lVar51 = lVar51 + 1;
    } while (lVar51 != lVar26);
  }
  if ((local_339 == '\x01') && ((cpi->sf).rt_sf.short_circuit_low_temp_var != 0)) {
    lVar26 = local_238 >> 2;
    if (BVar4 == BLOCK_64X64) {
      lVar51 = *(long *)(piVar33 + 0x14);
      BVar4 = (*(x->e_mbd).mi)->bsize;
      if (BVar4 != BLOCK_64X64) {
        if (BVar4 == BLOCK_64X32) {
          lVar73 = 0;
          bVar86 = true;
          do {
            bVar88 = bVar86;
            if (*(int *)(lVar51 + 0x1c + lVar73 * 0x10) < lVar26) {
              puVar65[lVar73 + 1] = '\x01';
            }
            lVar73 = 1;
            bVar86 = false;
          } while (bVar88);
        }
        else if (BVar4 == BLOCK_32X64) {
          lVar73 = 0;
          bVar86 = true;
          do {
            bVar88 = bVar86;
            if (*(int *)(lVar51 + 0x3c + lVar73 * 0x10) < lVar26) {
              puVar65[lVar73 + 3] = '\x01';
            }
            lVar73 = 1;
            bVar86 = false;
          } while (bVar88);
        }
        else {
          puVar56 = (x->part_search_info).variance_low + 9;
          piVar36 = (int *)(lVar51 + 0xac);
          lVar26 = 0;
          do {
            if ((((&DAT_00511fb4)[lVar26 * 2] + mi_col < (cpi->common).mi_params.mi_cols) &&
                ((&set_low_temp_var_flag_128x128_idx32)[lVar26 * 2] + mi_row <
                 (cpi->common).mi_params.mi_rows)) &&
               (pMVar16 = (cpi->common).mi_params.mi_grid_base
                          [(&DAT_00511fb4)[lVar26 * 2] + mi_col +
                           ((&set_low_temp_var_flag_128x128_idx32)[lVar26 * 2] + mi_row) *
                           (cpi->common).mi_params.mi_stride], pMVar16 != (MB_MODE_INFO *)0x0)) {
              BVar4 = pMVar16->bsize;
              if (BVar4 - 6 < 3) {
                lVar73 = 0;
                piVar76 = piVar36;
                do {
                  if ((long)*piVar76 < local_228 >> 8) {
                    puVar56[lVar73] = '\x01';
                  }
                  lVar73 = lVar73 + 1;
                  piVar76 = piVar76 + 0x2a4;
                } while (lVar73 != 4);
              }
              else if ((BVar4 == BLOCK_32X32) &&
                      ((long)*(int *)(lVar51 + 0x5c + lVar26 * 0x2a90) < iStack_230 * 5 >> 3)) {
                puVar65[lVar26 + 5] = '\x01';
              }
            }
            lVar26 = lVar26 + 1;
            puVar56 = puVar56 + 4;
            piVar36 = piVar36 + 0xaa4;
          } while (lVar26 != 4);
        }
        goto LAB_002533a8;
      }
      iVar68 = *(int *)(lVar51 + 0xc);
    }
    else {
      BVar4 = (*(x->e_mbd).mi)->bsize;
      if (BVar4 != BLOCK_128X128) {
        if (BVar4 == BLOCK_128X64) {
          lVar51 = 0;
          bVar86 = true;
          do {
            bVar88 = bVar86;
            if (piVar33[lVar51 * 4 + 7] < lVar26) {
              puVar65[lVar51 + 1] = '\x01';
            }
            lVar51 = 1;
            bVar86 = false;
          } while (bVar88);
        }
        else if (BVar4 == BLOCK_64X128) {
          lVar51 = 0;
          bVar86 = true;
          do {
            bVar88 = bVar86;
            if (piVar33[lVar51 * 4 + 0xf] < lVar26) {
              puVar65[lVar51 + 3] = '\x01';
            }
            lVar51 = 1;
            bVar86 = false;
          } while (bVar88);
        }
        else {
          lVar26 = iStack_230 * 5 >> 4;
          puVar56 = (x->part_search_info).variance_low + 0x29;
          lVar51 = 0xac;
          lVar73 = 0;
          do {
            iVar68 = (&set_low_temp_var_flag_128x128_idx64)[lVar73 * 2] + mi_row;
            iVar102 = (&DAT_00511f94)[lVar73 * 2] + mi_col;
            lVar67 = (long)((cpi->common).mi_params.mi_stride * iVar68 + iVar102);
            pMVar16 = (cpi->common).mi_params.mi_grid_base[lVar67];
            if (((pMVar16 != (MB_MODE_INFO *)0x0) && (iVar102 < (cpi->common).mi_params.mi_cols)) &&
               (iVar68 < (cpi->common).mi_params.mi_rows)) {
              BVar4 = pMVar16->bsize;
              if (BVar4 == BLOCK_64X64) {
                if ((long)*(int *)(*(long *)(piVar33 + 0x14) + 0xc + lVar73 * 0xaa90) <
                    iStack_230 * 5 >> 3) {
                  puVar65[lVar73 + 5] = '\x01';
                }
              }
              else if (BVar4 == BLOCK_64X32) {
                lVar67 = 0;
                bVar86 = true;
                do {
                  bVar88 = bVar86;
                  if (*(int *)(lVar67 * 0x10 + 0x1c + lVar73 * 0xaa90 + *(long *)(piVar33 + 0x14)) <
                      lVar26) {
                    puVar65[lVar67 + lVar73 * 2 + 9] = '\x01';
                  }
                  lVar67 = 1;
                  bVar86 = false;
                } while (bVar88);
              }
              else if (BVar4 == BLOCK_32X64) {
                lVar67 = 0;
                bVar86 = true;
                do {
                  bVar88 = bVar86;
                  if (*(int *)(lVar67 * 0x10 + 0x3c + lVar73 * 0xaa90 + *(long *)(piVar33 + 0x14)) <
                      lVar26) {
                    puVar65[lVar67 + lVar73 * 2 + 0x11] = '\x01';
                  }
                  lVar67 = 1;
                  bVar86 = false;
                } while (bVar88);
              }
              else {
                lVar79 = 0;
                puVar82 = puVar56;
                lVar71 = lVar51;
                do {
                  pMVar16 = (cpi->common).mi_params.mi_grid_base
                            [lVar67 + ((cpi->common).mi_params.mi_stride *
                                       (&set_low_temp_var_flag_128x128_idx32)[lVar79 * 2] +
                                      (&DAT_00511fb4)[lVar79 * 2])];
                  if (((pMVar16 != (MB_MODE_INFO *)0x0) &&
                      ((&DAT_00511fb4)[lVar79 * 2] + iVar102 < (cpi->common).mi_params.mi_cols)) &&
                     ((&set_low_temp_var_flag_128x128_idx32)[lVar79 * 2] + iVar68 <
                      (cpi->common).mi_params.mi_rows)) {
                    BVar4 = pMVar16->bsize;
                    if (BVar4 - 6 < 3) {
                      lVar72 = 0;
                      lVar63 = lVar71;
                      do {
                        if ((long)*(int *)(*(long *)(piVar33 + 0x14) + lVar63) < threshold_01 >> 8)
                        {
                          puVar82[lVar72] = '\x01';
                        }
                        lVar72 = lVar72 + 1;
                        lVar63 = lVar63 + 0xa90;
                      } while (lVar72 != 4);
                    }
                    else if ((BVar4 == BLOCK_32X32) &&
                            ((long)*(int *)(lVar79 * 0x2a90 + 0x5c +
                                           lVar73 * 0xaa90 + *(long *)(piVar33 + 0x14)) <
                             local_228 * 5 >> 3)) {
                      puVar65[lVar73 * 4 + 0x19 + lVar79] = '\x01';
                    }
                  }
                  lVar79 = lVar79 + 1;
                  puVar82 = puVar82 + 4;
                  lVar71 = lVar71 + 0x2a90;
                } while (lVar79 != 4);
              }
            }
            lVar73 = lVar73 + 1;
            puVar56 = puVar56 + 0x10;
            lVar51 = lVar51 + 0xaa90;
          } while (lVar73 != 4);
        }
        goto LAB_002533a8;
      }
      iVar68 = piVar33[3];
    }
    if ((long)iVar68 < local_238 >> 1) {
      *puVar65 = '\x01';
    }
  }
LAB_002533a8:
  aom_free(piVar33);
  return 0;
}

Assistant:

int av1_choose_var_based_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                      ThreadData *td, MACROBLOCK *x, int mi_row,
                                      int mi_col) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, choose_var_based_partitioning_time);
#endif
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int64_t *const vbp_thresholds = cpi->vbp_info.thresholds;
  PART_EVAL_STATUS force_split[85];
  int avg_64x64;
  int max_var_32x32[4];
  int min_var_32x32[4];
  int var_32x32;
  int var_64x64;
  int min_var_64x64 = INT_MAX;
  int max_var_64x64 = 0;
  int avg_16x16[4][4];
  int maxvar_16x16[4][4];
  int minvar_16x16[4][4];
  const uint8_t *src_buf;
  const uint8_t *dst_buf;
  int dst_stride;
  unsigned int uv_sad[MAX_MB_PLANE - 1];
  NOISE_LEVEL noise_level = kLow;
  bool is_zero_motion = true;
  bool scaled_ref_last = false;
  struct scale_factors sf_no_scale;
  av1_setup_scale_factors_for_frame(&sf_no_scale, cm->width, cm->height,
                                    cm->width, cm->height);

  bool is_key_frame =
      (frame_is_intra_only(cm) ||
       (cpi->ppi->use_svc &&
        cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame));

  assert(cm->seq_params->sb_size == BLOCK_64X64 ||
         cm->seq_params->sb_size == BLOCK_128X128);
  const bool is_small_sb = (cm->seq_params->sb_size == BLOCK_64X64);
  const int num_64x64_blocks = is_small_sb ? 1 : 4;

  unsigned int y_sad = UINT_MAX;
  unsigned int y_sad_g = UINT_MAX;
  unsigned int y_sad_alt = UINT_MAX;
  unsigned int y_sad_last = UINT_MAX;
  BLOCK_SIZE bsize = is_small_sb ? BLOCK_64X64 : BLOCK_128X128;

  // Force skip encoding for all superblocks on slide change for
  // non_reference_frames.
  if (cpi->sf.rt_sf.skip_encoding_non_reference_slide_change &&
      cpi->rc.high_source_sad && cpi->ppi->rtc_ref.non_reference_frame) {
    MB_MODE_INFO **mi = cm->mi_params.mi_grid_base +
                        get_mi_grid_idx(&cm->mi_params, mi_row, mi_col);
    av1_set_fixed_partitioning(cpi, tile, mi, mi_row, mi_col, bsize);
    x->force_zeromv_skip_for_sb = 1;
    return 0;
  }

  // Ref frame used in partitioning.
  MV_REFERENCE_FRAME ref_frame_partition = LAST_FRAME;

  int64_t thresholds[5] = { vbp_thresholds[0], vbp_thresholds[1],
                            vbp_thresholds[2], vbp_thresholds[3],
                            vbp_thresholds[4] };

  const int segment_id = xd->mi[0]->segment_id;
  uint64_t blk_sad = 0;
  if (cpi->src_sad_blk_64x64 != NULL &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    const int sb_size_by_mb = (cm->seq_params->sb_size == BLOCK_128X128)
                                  ? (cm->seq_params->mib_size >> 1)
                                  : cm->seq_params->mib_size;
    const int sb_cols =
        (cm->mi_params.mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
    const int sbi_col = mi_col / sb_size_by_mb;
    const int sbi_row = mi_row / sb_size_by_mb;
    blk_sad = cpi->src_sad_blk_64x64[sbi_col + sbi_row * sb_cols];
  }

  const bool is_segment_id_boosted =
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cm->seg.enabled &&
      cyclic_refresh_segment_id_boosted(segment_id);
  const int qindex =
      is_segment_id_boosted
          ? av1_get_qindex(&cm->seg, segment_id, cm->quant_params.base_qindex)
          : cm->quant_params.base_qindex;
  set_vbp_thresholds(
      cpi, thresholds, blk_sad, qindex, x->content_state_sb.low_sumdiff,
      x->content_state_sb.source_sad_nonrd, x->content_state_sb.source_sad_rd,
      is_segment_id_boosted, x->content_state_sb.lighting_change);

  src_buf = x->plane[AOM_PLANE_Y].src.buf;
  int src_stride = x->plane[AOM_PLANE_Y].src.stride;

  // Index for force_split: 0 for 64x64, 1-4 for 32x32 blocks,
  // 5-20 for the 16x16 blocks.
  force_split[0] = PART_EVAL_ALL;
  memset(x->part_search_info.variance_low, 0,
         sizeof(x->part_search_info.variance_low));

  // Check if LAST frame is NULL, and if so, treat this frame
  // as a key frame, for the purpose of the superblock partitioning.
  // LAST == NULL can happen in cases where enhancement spatial layers are
  // enabled dyanmically and the only reference is the spatial(GOLDEN).
  // If LAST frame has a different resolution: set the scaled_ref_last flag
  // and check if ref_scaled is NULL.
  if (!frame_is_intra_only(cm)) {
    const YV12_BUFFER_CONFIG *ref = get_ref_frame_yv12_buf(cm, LAST_FRAME);
    if (ref == NULL) {
      is_key_frame = true;
    } else if (ref->y_crop_height != cm->height ||
               ref->y_crop_width != cm->width) {
      scaled_ref_last = true;
      const YV12_BUFFER_CONFIG *ref_scaled =
          av1_get_scaled_ref_frame(cpi, LAST_FRAME);
      if (ref_scaled == NULL) is_key_frame = true;
    }
  }

  x->source_variance = UINT_MAX;
  // For nord_pickmode: compute source_variance, only for superblocks with
  // some motion for now. This input can then be used to bias the partitioning
  // or the chroma_check.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      x->content_state_sb.source_sad_nonrd > kLowSad)
    x->source_variance = av1_get_perpixel_variance_facade(
        cpi, xd, &x->plane[0].src, cm->seq_params->sb_size, AOM_PLANE_Y);

  if (!is_key_frame) {
    setup_planes(cpi, x, &y_sad, &y_sad_g, &y_sad_alt, &y_sad_last,
                 &ref_frame_partition, &sf_no_scale, mi_row, mi_col,
                 is_small_sb, scaled_ref_last);

    MB_MODE_INFO *mi = xd->mi[0];
    // Use reference SB directly for zero mv.
    if (mi->mv[0].as_int != 0) {
      dst_buf = xd->plane[AOM_PLANE_Y].dst.buf;
      dst_stride = xd->plane[AOM_PLANE_Y].dst.stride;
      is_zero_motion = false;
    } else {
      dst_buf = xd->plane[AOM_PLANE_Y].pre[0].buf;
      dst_stride = xd->plane[AOM_PLANE_Y].pre[0].stride;
    }
  } else {
    dst_buf = NULL;
    dst_stride = 0;
  }

  // check and set the color sensitivity of sb.
  av1_zero(uv_sad);
  chroma_check(cpi, x, bsize, y_sad_last, y_sad_g, y_sad_alt, is_key_frame,
               is_zero_motion, uv_sad);

  x->force_zeromv_skip_for_sb = 0;

  VP128x128 *vt;
  AOM_CHECK_MEM_ERROR(xd->error_info, vt, aom_malloc(sizeof(*vt)));
  vt->split = td->vt64x64;

  // If the superblock is completely static (zero source sad) and
  // the y_sad (relative to LAST ref) is very small, take the sb_size partition
  // and exit, and force zeromv_last skip mode for nonrd_pickmode.
  // Only do this on the base segment (so the QP-boosted segment, if applied,
  // can still continue cleaning/ramping up the quality).
  // Condition on color uv_sad is also added.
  if (!is_key_frame && cpi->sf.rt_sf.part_early_exit_zeromv &&
      cpi->rc.frames_since_key > 30 && segment_id == CR_SEGMENT_ID_BASE &&
      ref_frame_partition == LAST_FRAME && xd->mi[0]->mv[0].as_int == 0) {
    // Exit here, if zero mv skip flag is set at SB level.
    if (set_force_zeromv_skip_for_sb(cpi, x, tile, vt, uv_sad, mi_row, mi_col,
                                     y_sad, bsize))
      return 0;
  }

  if (cpi->noise_estimate.enabled)
    noise_level = av1_noise_estimate_extract_level(&cpi->noise_estimate);

  // Fill in the entire tree of 8x8 (for inter frames) or 4x4 (for key frames)
  // variances for splits.
  fill_variance_tree_leaves(cpi, x, vt, force_split, avg_16x16, maxvar_16x16,
                            minvar_16x16, thresholds, src_buf, src_stride,
                            dst_buf, dst_stride, is_key_frame, is_small_sb);

  avg_64x64 = 0;
  for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
    max_var_32x32[blk64_idx] = 0;
    min_var_32x32[blk64_idx] = INT_MAX;
    const int blk64_scale_idx = blk64_idx << 2;
    for (int lvl1_idx = 0; lvl1_idx < 4; lvl1_idx++) {
      const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
      for (int lvl2_idx = 0; lvl2_idx < 4; lvl2_idx++) {
        if (!is_key_frame) continue;
        VP16x16 *vtemp = &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
        for (int lvl3_idx = 0; lvl3_idx < 4; lvl3_idx++)
          fill_variance_tree(&vtemp->split[lvl3_idx], BLOCK_8X8);
        fill_variance_tree(vtemp, BLOCK_16X16);
        // If variance of this 16x16 block is above the threshold, force block
        // to split. This also forces a split on the upper levels.
        get_variance(&vtemp->part_variances.none);
        if (vtemp->part_variances.none.variance > thresholds[3]) {
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          force_split[split_index] =
              cpi->sf.rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var
                  ? get_part_eval_based_on_sub_blk_var(vtemp, thresholds[3])
                  : PART_EVAL_ONLY_SPLIT;
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
      fill_variance_tree(&vt->split[blk64_idx].split[lvl1_idx], BLOCK_32X32);
      // If variance of this 32x32 block is above the threshold, or if its above
      // (some threshold of) the average variance over the sub-16x16 blocks,
      // then force this block to split. This also forces a split on the upper
      // (64x64) level.
      uint64_t frame_sad_thresh = 20000;
      const int is_360p_or_smaller = cm->width * cm->height <= RESOLUTION_360P;
      if (cpi->svc.number_temporal_layers > 2 &&
          cpi->svc.temporal_layer_id == 0)
        frame_sad_thresh = frame_sad_thresh << 1;
      if (force_split[5 + blk64_scale_idx + lvl1_idx] == PART_EVAL_ALL) {
        get_variance(&vt->split[blk64_idx].split[lvl1_idx].part_variances.none);
        var_32x32 =
            vt->split[blk64_idx].split[lvl1_idx].part_variances.none.variance;
        max_var_32x32[blk64_idx] = AOMMAX(var_32x32, max_var_32x32[blk64_idx]);
        min_var_32x32[blk64_idx] = AOMMIN(var_32x32, min_var_32x32[blk64_idx]);
        const int max_min_var_16X16_diff = (maxvar_16x16[blk64_idx][lvl1_idx] -
                                            minvar_16x16[blk64_idx][lvl1_idx]);

        if (var_32x32 > thresholds[2] ||
            (!is_key_frame && var_32x32 > (thresholds[2] >> 1) &&
             var_32x32 > (avg_16x16[blk64_idx][lvl1_idx] >> 1))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        } else if (!is_key_frame && is_360p_or_smaller &&
                   ((max_min_var_16X16_diff > (thresholds[2] >> 1) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > thresholds[2]) ||
                    (cpi->sf.rt_sf.prefer_large_partition_blocks &&
                     x->content_state_sb.source_sad_nonrd > kLowSad &&
                     cpi->rc.frame_source_sad < frame_sad_thresh &&
                     maxvar_16x16[blk64_idx][lvl1_idx] > (thresholds[2] >> 4) &&
                     maxvar_16x16[blk64_idx][lvl1_idx] >
                         (minvar_16x16[blk64_idx][lvl1_idx] << 2)))) {
          force_split[5 + blk64_scale_idx + lvl1_idx] = PART_EVAL_ONLY_SPLIT;
          force_split[blk64_idx + 1] = PART_EVAL_ONLY_SPLIT;
          force_split[0] = PART_EVAL_ONLY_SPLIT;
        }
      }
    }
    if (force_split[1 + blk64_idx] == PART_EVAL_ALL) {
      fill_variance_tree(&vt->split[blk64_idx], BLOCK_64X64);
      get_variance(&vt->split[blk64_idx].part_variances.none);
      var_64x64 = vt->split[blk64_idx].part_variances.none.variance;
      max_var_64x64 = AOMMAX(var_64x64, max_var_64x64);
      min_var_64x64 = AOMMIN(var_64x64, min_var_64x64);
      // If the difference of the max-min variances of sub-blocks or max
      // variance of a sub-block is above some threshold of then force this
      // block to split. Only checking this for noise level >= medium, if
      // encoder is in SVC or if we already forced large blocks.
      const int max_min_var_32x32_diff =
          max_var_32x32[blk64_idx] - min_var_32x32[blk64_idx];
      const int check_max_var = max_var_32x32[blk64_idx] > thresholds[1] >> 1;
      const bool check_noise_lvl = noise_level >= kMedium ||
                                   cpi->ppi->use_svc ||
                                   cpi->sf.rt_sf.prefer_large_partition_blocks;
      const int64_t set_threshold = 3 * (thresholds[1] >> 3);

      if (!is_key_frame && max_min_var_32x32_diff > set_threshold &&
          check_max_var && check_noise_lvl) {
        force_split[1 + blk64_idx] = PART_EVAL_ONLY_SPLIT;
        force_split[0] = PART_EVAL_ONLY_SPLIT;
      }
      avg_64x64 += var_64x64;
    }
    if (is_small_sb) force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (force_split[0] == PART_EVAL_ALL) {
    fill_variance_tree(vt, BLOCK_128X128);
    get_variance(&vt->part_variances.none);
    const int set_avg_64x64 = (9 * avg_64x64) >> 5;
    if (!is_key_frame && vt->part_variances.none.variance > set_avg_64x64)
      force_split[0] = PART_EVAL_ONLY_SPLIT;

    if (!is_key_frame &&
        (max_var_64x64 - min_var_64x64) > 3 * (thresholds[0] >> 3) &&
        max_var_64x64 > thresholds[0] >> 1)
      force_split[0] = PART_EVAL_ONLY_SPLIT;
  }

  if (mi_col + 32 > tile->mi_col_end || mi_row + 32 > tile->mi_row_end ||
      !set_vt_partitioning(cpi, xd, tile, vt, BLOCK_128X128, mi_row, mi_col,
                           thresholds[0], BLOCK_16X16, force_split[0])) {
    for (int blk64_idx = 0; blk64_idx < num_64x64_blocks; ++blk64_idx) {
      const int x64_idx = GET_BLK_IDX_X(blk64_idx, 4);
      const int y64_idx = GET_BLK_IDX_Y(blk64_idx, 4);
      const int blk64_scale_idx = blk64_idx << 2;

      // Now go through the entire structure, splitting every block size until
      // we get to one that's got a variance lower than our threshold.
      if (set_vt_partitioning(cpi, xd, tile, &vt->split[blk64_idx], BLOCK_64X64,
                              mi_row + y64_idx, mi_col + x64_idx, thresholds[1],
                              BLOCK_16X16, force_split[1 + blk64_idx]))
        continue;
      for (int lvl1_idx = 0; lvl1_idx < 4; ++lvl1_idx) {
        const int x32_idx = GET_BLK_IDX_X(lvl1_idx, 3);
        const int y32_idx = GET_BLK_IDX_Y(lvl1_idx, 3);
        const int lvl1_scale_idx = (blk64_scale_idx + lvl1_idx) << 2;
        if (set_vt_partitioning(
                cpi, xd, tile, &vt->split[blk64_idx].split[lvl1_idx],
                BLOCK_32X32, (mi_row + y64_idx + y32_idx),
                (mi_col + x64_idx + x32_idx), thresholds[2], BLOCK_16X16,
                force_split[5 + blk64_scale_idx + lvl1_idx]))
          continue;
        for (int lvl2_idx = 0; lvl2_idx < 4; ++lvl2_idx) {
          const int x16_idx = GET_BLK_IDX_X(lvl2_idx, 2);
          const int y16_idx = GET_BLK_IDX_Y(lvl2_idx, 2);
          const int split_index = 21 + lvl1_scale_idx + lvl2_idx;
          VP16x16 *vtemp =
              &vt->split[blk64_idx].split[lvl1_idx].split[lvl2_idx];
          if (set_vt_partitioning(cpi, xd, tile, vtemp, BLOCK_16X16,
                                  mi_row + y64_idx + y32_idx + y16_idx,
                                  mi_col + x64_idx + x32_idx + x16_idx,
                                  thresholds[3], BLOCK_8X8,
                                  force_split[split_index]))
            continue;
          for (int lvl3_idx = 0; lvl3_idx < 4; ++lvl3_idx) {
            const int x8_idx = GET_BLK_IDX_X(lvl3_idx, 1);
            const int y8_idx = GET_BLK_IDX_Y(lvl3_idx, 1);
            set_block_size(cpi, (mi_row + y64_idx + y32_idx + y16_idx + y8_idx),
                           (mi_col + x64_idx + x32_idx + x16_idx + x8_idx),
                           BLOCK_8X8);
          }
        }
      }
    }
  }

  if (cpi->sf.rt_sf.short_circuit_low_temp_var) {
    set_low_temp_var_flag(cpi, &x->part_search_info, xd, vt, thresholds,
                          ref_frame_partition, mi_col, mi_row, is_small_sb);
  }

  aom_free(vt);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, choose_var_based_partitioning_time);
#endif
  return 0;
}